

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort uVar9;
  int iVar10;
  size_t sVar11;
  Geometry *pGVar12;
  long lVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  byte bVar18;
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar34;
  undefined4 uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  RTCRayN *pRVar43;
  RTCFilterFunctionN p_Var44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  undefined4 uVar48;
  RTCIntersectArguments *pRVar49;
  long lVar50;
  undefined1 auVar51 [8];
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  size_t sVar55;
  long lVar56;
  long lVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  byte bVar70;
  char cVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  byte bVar106;
  byte bVar108;
  char cVar111;
  float fVar112;
  char cVar114;
  char cVar115;
  float fVar118;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  char cVar107;
  char cVar109;
  char cVar110;
  byte bVar117;
  undefined1 auVar82 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar113;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar105;
  float fVar122;
  float fVar143;
  float fVar144;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar145;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  float fVar166;
  float fVar167;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar168;
  undefined1 auVar152 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar169;
  float fVar183;
  float fVar184;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar186;
  undefined1 auVar176 [16];
  float fVar185;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar187;
  float fVar196;
  float fVar197;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar198;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar199;
  float fVar207;
  float fVar209;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar208;
  float fVar210;
  float fVar211;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar212 [16];
  float fVar219;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar220;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [16];
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<4>_> *local_1430;
  vbool<4> valid;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  ulong local_13c0;
  undefined1 local_13b8 [8];
  float fStack_13b0;
  float fStack_13ac;
  RTCFilterFunctionNArguments args;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1348;
  float fStack_1340;
  float fStack_133c;
  vfloat<4> tNear;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float local_1288 [4];
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  undefined8 local_11e8;
  float fStack_11e0;
  float fStack_11dc;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined4 uStack_11b8;
  float fStack_11b4;
  ulong local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  ulong local_1188;
  long local_1180;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  ulong local_1150;
  long local_1148;
  ulong local_1140;
  ulong local_1138;
  long local_1130;
  Scene *local_1128;
  ulong local_1120;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined1 local_1068 [8];
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar83 [16];
  undefined1 auVar75 [11];
  undefined1 auVar84 [16];
  undefined1 auVar90 [16];
  undefined1 auVar76 [12];
  undefined1 auVar85 [16];
  undefined1 auVar77 [13];
  undefined1 auVar86 [16];
  undefined1 auVar91 [16];
  undefined1 auVar88 [16];
  undefined1 auVar87 [16];
  undefined2 uVar116;
  
  local_1430 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1248 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1278 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10a8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fStack_10a4 = local_10a8;
  fStack_10a0 = local_10a8;
  fStack_109c = local_10a8;
  local_1108 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar250 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1118 = local_1108 * 0.99999964;
  local_10e8._0_4_ = fVar72 * 0.99999964;
  local_10e8._4_4_ = local_10e8._0_4_;
  fStack_10e0 = (float)local_10e8._0_4_;
  fStack_10dc = (float)local_10e8._0_4_;
  local_10d8 = fVar250 * 0.99999964;
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  local_1108 = local_1108 * 1.0000004;
  local_10b8._0_4_ = fVar72 * 1.0000004;
  local_10b8._4_4_ = local_10b8._0_4_;
  fStack_10b0 = (float)local_10b8._0_4_;
  fStack_10ac = (float)local_10b8._0_4_;
  local_10c8._0_4_ = fVar250 * 1.0000004;
  local_10c8._4_4_ = local_10c8._0_4_;
  fStack_10c0 = (float)local_10c8._0_4_;
  fStack_10bc = (float)local_10c8._0_4_;
  local_1150 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1158 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1160 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_10f8 = (tray->tnear).field_0.i[k];
  iStack_10f4 = local_10f8;
  iStack_10f0 = local_10f8;
  iStack_10ec = local_10f8;
  local_1238 = (tray->tfar).field_0.i[k];
  iStack_1234 = local_1238;
  iStack_1230 = local_1238;
  iStack_122c = local_1238;
  local_1188 = local_1150 >> 2;
  local_1168 = local_1150 ^ 0x10;
  local_1190 = (local_1150 ^ 0x10) >> 2;
  local_1198 = local_1158 >> 2;
  local_1170 = local_1158 ^ 0x10;
  local_11a0 = (local_1158 ^ 0x10) >> 2;
  local_11a8 = local_1160 >> 2;
  local_1178 = local_1160 ^ 0x10;
  local_11b0 = (local_1160 ^ 0x10) >> 2;
  lVar40 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_1244 = local_1248;
  fStack_1240 = local_1248;
  fStack_123c = local_1248;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  fStack_1114 = local_1118;
  fStack_1110 = local_1118;
  fStack_110c = local_1118;
  fVar113 = local_1108;
  fVar198 = local_1108;
  fVar225 = local_1108;
  fVar230 = local_1108;
  fVar219 = local_1118;
  fVar185 = local_1118;
  fVar253 = local_1118;
  fVar208 = local_1118;
  fVar112 = local_1248;
  fVar251 = local_1248;
  fVar74 = local_1248;
  fVar73 = local_1248;
  fVar187 = local_1278;
  fVar257 = local_1278;
  fVar250 = local_1278;
  fVar72 = local_1278;
  while (local_1430 != stack) {
    pSVar34 = local_1430 + -1;
    local_1430 = local_1430 + -1;
    if ((float)pSVar34->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar34->dist == *(float *)(ray + k * 4 + 0x80)) {
      sVar55 = (local_1430->ptr).ptr;
      do {
        if ((sVar55 & 8) == 0) {
          pfVar5 = (float *)(sVar55 + 0x20 + local_1150);
          auVar148._0_4_ = (*pfVar5 - fVar73) * fVar208;
          auVar148._4_4_ = (pfVar5[1] - fVar74) * fVar253;
          auVar148._8_4_ = (pfVar5[2] - fVar251) * fVar185;
          auVar148._12_4_ = (pfVar5[3] - fVar112) * fVar219;
          pfVar5 = (float *)(sVar55 + 0x20 + local_1158);
          auVar201._0_4_ = (*pfVar5 - fVar72) * (float)local_10e8._0_4_;
          auVar201._4_4_ = (pfVar5[1] - fVar250) * (float)local_10e8._4_4_;
          auVar201._8_4_ = (pfVar5[2] - fVar257) * fStack_10e0;
          auVar201._12_4_ = (pfVar5[3] - fVar187) * fStack_10dc;
          auVar78 = maxps(auVar148,auVar201);
          pfVar5 = (float *)(sVar55 + 0x20 + local_1160);
          auVar123._0_4_ = (*pfVar5 - local_10a8) * local_10d8;
          auVar123._4_4_ = (pfVar5[1] - fStack_10a4) * fStack_10d4;
          auVar123._8_4_ = (pfVar5[2] - fStack_10a0) * fStack_10d0;
          auVar123._12_4_ = (pfVar5[3] - fStack_109c) * fStack_10cc;
          pfVar5 = (float *)(sVar55 + 0x20 + local_1168);
          auVar147._0_4_ = (*pfVar5 - fVar73) * fVar230;
          auVar147._4_4_ = (pfVar5[1] - fVar74) * fVar225;
          auVar147._8_4_ = (pfVar5[2] - fVar251) * fVar198;
          auVar147._12_4_ = (pfVar5[3] - fVar112) * fVar113;
          pfVar5 = (float *)(sVar55 + 0x20 + local_1170);
          auVar170._0_4_ = (*pfVar5 - fVar72) * (float)local_10b8._0_4_;
          auVar170._4_4_ = (pfVar5[1] - fVar250) * (float)local_10b8._4_4_;
          auVar170._8_4_ = (pfVar5[2] - fVar257) * fStack_10b0;
          auVar170._12_4_ = (pfVar5[3] - fVar187) * fStack_10ac;
          auVar148 = minps(auVar147,auVar170);
          pfVar5 = (float *)(sVar55 + 0x20 + local_1178);
          auVar171._0_4_ = (*pfVar5 - local_10a8) * (float)local_10c8._0_4_;
          auVar171._4_4_ = (pfVar5[1] - fStack_10a4) * (float)local_10c8._4_4_;
          auVar171._8_4_ = (pfVar5[2] - fStack_10a0) * fStack_10c0;
          auVar171._12_4_ = (pfVar5[3] - fStack_109c) * fStack_10bc;
          auVar124._4_4_ = iStack_10f4;
          auVar124._0_4_ = local_10f8;
          auVar124._8_4_ = iStack_10f0;
          auVar124._12_4_ = iStack_10ec;
          auVar124 = maxps(auVar123,auVar124);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar78,auVar124);
          auVar78._4_4_ = iStack_1234;
          auVar78._0_4_ = local_1238;
          auVar78._8_4_ = iStack_1230;
          auVar78._12_4_ = iStack_122c;
          auVar78 = minps(auVar171,auVar78);
          auVar78 = minps(auVar148,auVar78);
          auVar189._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar78._4_4_);
          auVar189._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar78._0_4_);
          auVar189._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar78._8_4_);
          auVar189._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar78._12_4_);
          uVar35 = movmskps((int)local_1178,auVar189);
          local_1140 = CONCAT44((int)(local_1178 >> 0x20),uVar35);
        }
        if ((sVar55 & 8) == 0) {
          if (local_1140 == 0) {
            iVar38 = 4;
          }
          else {
            uVar54 = sVar55 & 0xfffffffffffffff0;
            lVar41 = 0;
            if (local_1140 != 0) {
              for (; (local_1140 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
              }
            }
            iVar38 = 0;
            sVar55 = *(size_t *)(uVar54 + lVar41 * 8);
            uVar52 = local_1140 - 1 & local_1140;
            if (uVar52 != 0) {
              uVar36 = tNear.field_0.i[lVar41];
              lVar41 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              sVar11 = *(size_t *)(uVar54 + lVar41 * 8);
              uVar39 = tNear.field_0.i[lVar41];
              uVar52 = uVar52 - 1 & uVar52;
              if (uVar52 == 0) {
                if (uVar36 < uVar39) {
                  (local_1430->ptr).ptr = sVar11;
                  local_1430->dist = uVar39;
                  local_1430 = local_1430 + 1;
                }
                else {
                  (local_1430->ptr).ptr = sVar55;
                  local_1430->dist = uVar36;
                  sVar55 = sVar11;
                  local_1430 = local_1430 + 1;
                }
              }
              else {
                auVar79._8_4_ = uVar36;
                auVar79._0_8_ = sVar55;
                auVar79._12_4_ = 0;
                auVar125._8_4_ = uVar39;
                auVar125._0_8_ = sVar11;
                auVar125._12_4_ = 0;
                lVar41 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                uVar42 = *(ulong *)(uVar54 + lVar41 * 8);
                iVar47 = tNear.field_0.i[lVar41];
                auVar149._8_4_ = iVar47;
                auVar149._0_8_ = uVar42;
                auVar149._12_4_ = 0;
                auVar172._8_4_ = -(uint)((int)uVar36 < (int)uVar39);
                uVar52 = uVar52 - 1 & uVar52;
                fVar72 = local_1278;
                fVar250 = fStack_1274;
                fVar257 = fStack_1270;
                fVar187 = fStack_126c;
                if (uVar52 == 0) {
                  auVar172._4_4_ = auVar172._8_4_;
                  auVar172._0_4_ = auVar172._8_4_;
                  auVar172._12_4_ = auVar172._8_4_;
                  auVar78 = auVar79 & auVar172 | ~auVar172 & auVar125;
                  auVar124 = auVar125 & auVar172 | ~auVar172 & auVar79;
                  auVar173._8_4_ = -(uint)(auVar78._8_4_ < iVar47);
                  auVar173._0_8_ = CONCAT44(auVar173._8_4_,auVar173._8_4_);
                  auVar173._12_4_ = auVar173._8_4_;
                  sVar55 = ~auVar173._0_8_ & uVar42 | auVar78._0_8_ & auVar173._0_8_;
                  auVar78 = auVar149 & auVar173 | ~auVar173 & auVar78;
                  auVar80._8_4_ = -(uint)(auVar124._8_4_ < auVar78._8_4_);
                  auVar80._4_4_ = auVar80._8_4_;
                  auVar80._0_4_ = auVar80._8_4_;
                  auVar80._12_4_ = auVar80._8_4_;
                  *local_1430 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar80 & auVar124 | auVar78 & auVar80);
                  local_1430[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(auVar124 & auVar80 | ~auVar80 & auVar78)
                  ;
                  local_1430 = local_1430 + 2;
                }
                else {
                  lVar41 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                    }
                  }
                  iVar10 = tNear.field_0.i[lVar41];
                  auVar188._8_4_ = iVar10;
                  auVar188._0_8_ = *(undefined8 *)(uVar54 + lVar41 * 8);
                  auVar188._12_4_ = 0;
                  auVar174._4_4_ = auVar172._8_4_;
                  auVar174._0_4_ = auVar172._8_4_;
                  auVar174._8_4_ = auVar172._8_4_;
                  auVar174._12_4_ = auVar172._8_4_;
                  auVar78 = auVar79 & auVar174 | ~auVar174 & auVar125;
                  auVar124 = auVar125 & auVar174 | ~auVar174 & auVar79;
                  auVar200._0_4_ = -(uint)(iVar47 < iVar10);
                  auVar200._4_4_ = -(uint)(iVar47 < iVar10);
                  auVar200._8_4_ = -(uint)(iVar47 < iVar10);
                  auVar200._12_4_ = -(uint)(iVar47 < iVar10);
                  auVar148 = auVar149 & auVar200 | ~auVar200 & auVar188;
                  auVar201 = ~auVar200 & auVar149 | auVar188 & auVar200;
                  auVar150._8_4_ = -(uint)(auVar124._8_4_ < auVar201._8_4_);
                  auVar150._4_4_ = auVar150._8_4_;
                  auVar150._0_4_ = auVar150._8_4_;
                  auVar150._12_4_ = auVar150._8_4_;
                  auVar189 = auVar124 & auVar150 | ~auVar150 & auVar201;
                  auVar126._8_4_ = -(uint)(auVar78._8_4_ < auVar148._8_4_);
                  auVar126._0_8_ = CONCAT44(auVar126._8_4_,auVar126._8_4_);
                  auVar126._12_4_ = auVar126._8_4_;
                  sVar55 = auVar78._0_8_ & auVar126._0_8_ | ~auVar126._0_8_ & auVar148._0_8_;
                  auVar78 = ~auVar126 & auVar78 | auVar148 & auVar126;
                  auVar81._8_4_ = -(uint)(auVar78._8_4_ < auVar189._8_4_);
                  auVar81._4_4_ = auVar81._8_4_;
                  auVar81._0_4_ = auVar81._8_4_;
                  auVar81._12_4_ = auVar81._8_4_;
                  *local_1430 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar150 & auVar124 | auVar201 & auVar150);
                  local_1430[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(~auVar81 & auVar78 | auVar189 & auVar81)
                  ;
                  local_1430[2] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(auVar78 & auVar81 | ~auVar81 & auVar189)
                  ;
                  fVar73 = local_1248;
                  fVar74 = fStack_1244;
                  fVar251 = fStack_1240;
                  fVar112 = fStack_123c;
                  local_1430 = local_1430 + 3;
                }
              }
            }
          }
        }
        else {
          iVar38 = 6;
        }
      } while (iVar38 == 0);
      if (iVar38 == 6) {
        local_1180 = (ulong)((uint)sVar55 & 0xf) - 8;
        if (local_1180 != 0) {
          uVar54 = sVar55 & 0xfffffffffffffff0;
          local_1148 = 0;
          local_1138 = uVar54;
          do {
            lVar41 = local_1148 * 0x58;
            local_1130 = uVar54 + lVar41;
            uVar7 = *(undefined8 *)(uVar54 + 0x20 + lVar41);
            uVar35 = *(undefined4 *)(uVar54 + 0x24 + lVar41);
            bVar117 = (byte)uVar7;
            bVar70 = (byte)uVar35;
            bVar14 = (byte)((ulong)uVar7 >> 8);
            bVar106 = (byte)((uint)uVar35 >> 8);
            bVar15 = (byte)((ulong)uVar7 >> 0x10);
            bVar108 = (byte)((uint)uVar35 >> 0x10);
            bVar18 = (byte)((uint)uVar35 >> 0x18);
            bVar16 = (byte)((ulong)uVar7 >> 0x18);
            cVar71 = -((byte)((bVar117 < bVar70) * bVar117 | (bVar117 >= bVar70) * bVar70) ==
                      bVar117);
            cVar107 = -((byte)((bVar14 < bVar106) * bVar14 | (bVar14 >= bVar106) * bVar106) ==
                       bVar14);
            cVar109 = -((byte)((bVar15 < bVar108) * bVar15 | (bVar15 >= bVar108) * bVar108) ==
                       bVar15);
            cVar110 = -((byte)((bVar16 < bVar18) * bVar16 | (bVar16 >= bVar18) * bVar18) == bVar16);
            cVar111 = -((char)((ulong)uVar7 >> 0x20) == '\0');
            cVar114 = -((char)((ulong)uVar7 >> 0x28) == '\0');
            cVar115 = -((char)((ulong)uVar7 >> 0x30) == '\0');
            bVar117 = -((char)((ulong)uVar7 >> 0x38) == '\0');
            auVar83._0_9_ = CONCAT18(0xff,(ulong)bVar117 << 0x38);
            auVar75._0_10_ = CONCAT19(0xff,auVar83._0_9_);
            auVar75[10] = 0xff;
            auVar76[0xb] = 0xff;
            auVar76._0_11_ = auVar75;
            auVar77[0xc] = 0xff;
            auVar77._0_12_ = auVar76;
            auVar88[0xd] = 0xff;
            auVar88._0_13_ = auVar77;
            fVar72 = *(float *)(uVar54 + 0x38 + lVar41);
            fVar250 = *(float *)(uVar54 + 0x3c + lVar41);
            fVar257 = *(float *)(uVar54 + 0x44 + lVar41);
            uVar36 = *(uint *)(local_1188 + 0x20 + local_1130);
            auVar24[0xc] = (char)(uVar36 >> 0x18);
            auVar24._0_12_ = ZEXT712(0);
            uVar39 = *(uint *)(local_1190 + 0x20 + local_1130);
            auVar19[0xc] = (char)(uVar39 >> 0x18);
            auVar19._0_12_ = ZEXT712(0);
            fVar187 = *(float *)(uVar54 + 0x48 + lVar41);
            uVar37 = *(uint *)(local_1198 + 0x20 + local_1130);
            auVar20[0xc] = (char)(uVar37 >> 0x18);
            auVar20._0_12_ = ZEXT712(0);
            uVar45 = *(uint *)(local_11a0 + 0x20 + local_1130);
            auVar21[0xc] = (char)(uVar45 >> 0x18);
            auVar21._0_12_ = ZEXT712(0);
            fVar73 = *(float *)(uVar54 + 0x4c + lVar41);
            uVar46 = *(uint *)(local_11a8 + 0x20 + local_1130);
            auVar22[0xc] = (char)(uVar46 >> 0x18);
            auVar22._0_12_ = ZEXT712(0);
            uVar58 = *(uint *)(local_11b0 + 0x20 + local_1130);
            auVar23[0xc] = (char)(uVar58 >> 0x18);
            auVar23._0_12_ = ZEXT712(0);
            fVar74 = *(float *)(uVar54 + 0x40 + lVar41);
            auVar127._0_4_ = (((float)(uVar36 & 0xff) * fVar257 + fVar72) - local_1248) * local_1118
            ;
            auVar127._4_4_ =
                 (((float)(uVar36 >> 8 & 0xff) * fVar257 + fVar72) - fStack_1244) * fStack_1114;
            auVar127._8_4_ =
                 (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar36 >> 0x10)) * fVar257 +
                  fVar72) - fStack_1240) * fStack_1110;
            auVar127._12_4_ =
                 (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar257 + fVar72) - fStack_123c) *
                 fStack_110c;
            auVar190._0_4_ =
                 (((float)(uVar37 & 0xff) * fVar187 + fVar250) - local_1278) *
                 (float)local_10e8._0_4_;
            auVar190._4_4_ =
                 (((float)(uVar37 >> 8 & 0xff) * fVar187 + fVar250) - fStack_1274) *
                 (float)local_10e8._4_4_;
            auVar190._8_4_ =
                 (((float)(int)CONCAT32(auVar20._10_3_,(ushort)(byte)(uVar37 >> 0x10)) * fVar187 +
                  fVar250) - fStack_1270) * fStack_10e0;
            auVar190._12_4_ =
                 (((float)(uint3)(auVar20._10_3_ >> 0x10) * fVar187 + fVar250) - fStack_126c) *
                 fStack_10dc;
            auVar78 = maxps(auVar127,auVar190);
            auVar151._0_4_ = (((float)(uVar39 & 0xff) * fVar257 + fVar72) - local_1248) * local_1108
            ;
            auVar151._4_4_ =
                 (((float)(uVar39 >> 8 & 0xff) * fVar257 + fVar72) - fStack_1244) * fStack_1104;
            auVar151._8_4_ =
                 (((float)(int)CONCAT32(auVar19._10_3_,(ushort)(byte)(uVar39 >> 0x10)) * fVar257 +
                  fVar72) - fStack_1240) * fStack_1100;
            auVar151._12_4_ =
                 (((float)(uint3)(auVar19._10_3_ >> 0x10) * fVar257 + fVar72) - fStack_123c) *
                 fStack_10fc;
            auVar175._0_4_ =
                 (((float)(uVar45 & 0xff) * fVar187 + fVar250) - local_1278) *
                 (float)local_10b8._0_4_;
            auVar175._4_4_ =
                 (((float)(uVar45 >> 8 & 0xff) * fVar187 + fVar250) - fStack_1274) *
                 (float)local_10b8._4_4_;
            auVar175._8_4_ =
                 (((float)(int)CONCAT32(auVar21._10_3_,(ushort)(byte)(uVar45 >> 0x10)) * fVar187 +
                  fVar250) - fStack_1270) * fStack_10b0;
            auVar175._12_4_ =
                 (((float)(uint3)(auVar21._10_3_ >> 0x10) * fVar187 + fVar250) - fStack_126c) *
                 fStack_10ac;
            auVar124 = minps(auVar151,auVar175);
            auVar202._0_4_ = (((float)(uVar46 & 0xff) * fVar73 + fVar74) - local_10a8) * local_10d8;
            auVar202._4_4_ =
                 (((float)(uVar46 >> 8 & 0xff) * fVar73 + fVar74) - fStack_10a4) * fStack_10d4;
            auVar202._8_4_ =
                 (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar46 >> 0x10)) * fVar73 +
                  fVar74) - fStack_10a0) * fStack_10d0;
            auVar202._12_4_ =
                 (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar73 + fVar74) - fStack_109c) *
                 fStack_10cc;
            auVar29._4_4_ = iStack_10f4;
            auVar29._0_4_ = local_10f8;
            auVar29._8_4_ = iStack_10f0;
            auVar29._12_4_ = iStack_10ec;
            auVar148 = maxps(auVar202,auVar29);
            dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar78,auVar148);
            auVar212._0_4_ =
                 (((float)(uVar58 & 0xff) * fVar73 + fVar74) - local_10a8) * (float)local_10c8._0_4_
            ;
            auVar212._4_4_ =
                 (((float)(uVar58 >> 8 & 0xff) * fVar73 + fVar74) - fStack_10a4) *
                 (float)local_10c8._4_4_;
            auVar212._8_4_ =
                 (((float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar58 >> 0x10)) * fVar73 +
                  fVar74) - fStack_10a0) * fStack_10c0;
            auVar212._12_4_ =
                 (((float)(uint3)(auVar23._10_3_ >> 0x10) * fVar73 + fVar74) - fStack_109c) *
                 fStack_10bc;
            auVar27._4_4_ = iStack_1234;
            auVar27._0_4_ = local_1238;
            auVar27._8_4_ = iStack_1230;
            auVar27._12_4_ = iStack_122c;
            auVar78 = minps(auVar212,auVar27);
            auVar78 = minps(auVar124,auVar78);
            auVar88[0xe] = bVar117;
            auVar88[0xf] = bVar117;
            auVar87._14_2_ = auVar88._14_2_;
            auVar87[0xd] = cVar115;
            auVar87._0_13_ = auVar77;
            auVar86._13_3_ = auVar87._13_3_;
            auVar86[0xc] = cVar115;
            auVar86._0_12_ = auVar76;
            auVar85._12_4_ = auVar86._12_4_;
            auVar85[0xb] = cVar114;
            auVar85._0_11_ = auVar75;
            auVar84._11_5_ = auVar85._11_5_;
            auVar84[10] = cVar114;
            auVar84._0_10_ = auVar75._0_10_;
            auVar83._10_6_ = auVar84._10_6_;
            auVar83[9] = cVar111;
            Var32 = CONCAT91(CONCAT81((long)(CONCAT72(auVar83._9_7_,CONCAT11(cVar111,bVar117)) >> 8)
                                      ,cVar110),cVar110);
            auVar31._2_10_ = Var32;
            auVar31[1] = cVar109;
            auVar31[0] = cVar109;
            auVar30._2_12_ = auVar31;
            auVar30[1] = cVar107;
            auVar30[0] = cVar107;
            auVar82._0_2_ = CONCAT11(cVar71,cVar71);
            auVar82._2_14_ = auVar30;
            uVar116 = (undefined2)Var32;
            auVar91._0_12_ = auVar82._0_12_;
            auVar91._12_2_ = uVar116;
            auVar91._14_2_ = uVar116;
            auVar90._12_4_ = auVar91._12_4_;
            auVar90._0_10_ = auVar82._0_10_;
            auVar90._10_2_ = auVar31._0_2_;
            auVar89._10_6_ = auVar90._10_6_;
            auVar89._0_8_ = auVar82._0_8_;
            auVar89._8_2_ = auVar31._0_2_;
            auVar33._4_8_ = auVar89._8_8_;
            auVar33._2_2_ = auVar30._0_2_;
            auVar33._0_2_ = auVar30._0_2_;
            uVar36 = CONCAT22(auVar82._0_2_,auVar82._0_2_);
            auVar128._0_4_ = -(uint)(dist.field_0._0_4_ <= auVar78._0_4_) & uVar36;
            auVar128._4_4_ = -(uint)(dist.field_0._4_4_ <= auVar78._4_4_) & auVar33._0_4_;
            auVar128._8_4_ = -(uint)(dist.field_0._8_4_ <= auVar78._8_4_) & auVar89._8_4_;
            auVar128._12_4_ = -(uint)(dist.field_0._12_4_ <= auVar78._12_4_) & auVar90._12_4_;
            uVar36 = movmskps((int)lVar41,auVar128);
            if (uVar36 != 0) {
              local_1120 = (ulong)(uVar36 & 0xff);
              do {
                lVar41 = 0;
                if (local_1120 != 0) {
                  for (; (local_1120 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                fVar72 = *(float *)(ray + k * 4 + 0x80);
                if (*(float *)((long)&stack[-1].ptr.ptr + lVar41 * 4) <= fVar72) {
                  uVar8 = *(ushort *)(local_1130 + lVar41 * 8);
                  uVar9 = *(ushort *)(local_1130 + 2 + lVar41 * 8);
                  uVar36 = *(uint *)(local_1130 + 0x50);
                  uVar52 = (ulong)uVar36;
                  uVar39 = *(uint *)(local_1130 + 4 + lVar41 * 8);
                  auVar51 = (undefined1  [8])CONCAT44(0,uVar39);
                  local_1128 = context->scene;
                  pGVar12 = (local_1128->geometries).items[uVar52].ptr;
                  lVar13 = *(long *)&pGVar12->field_0x58;
                  lVar41 = *(long *)&pGVar12[1].time_range.upper;
                  lVar56 = (long)auVar51 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  uVar45 = uVar8 & 0x7fff;
                  uVar46 = uVar9 & 0x7fff;
                  uVar37 = *(uint *)(lVar13 + 4 + lVar56);
                  uVar42 = (ulong)uVar37;
                  uVar53 = (ulong)(uVar37 * uVar46 + *(int *)(lVar13 + lVar56) + uVar45);
                  p_Var44 = pGVar12[1].intersectionFilterN;
                  pfVar5 = (float *)(lVar41 + (long)p_Var44 * uVar53);
                  pfVar1 = (float *)(lVar41 + (uVar53 + 1) * (long)p_Var44);
                  fVar250 = *pfVar1;
                  local_11f8 = pfVar1[1];
                  fVar257 = pfVar1[2];
                  pfVar1 = (float *)(lVar41 + (uVar53 + uVar42) * (long)p_Var44);
                  fVar187 = *pfVar1;
                  fVar73 = pfVar1[1];
                  fVar74 = pfVar1[2];
                  lVar57 = uVar53 + uVar42 + 1;
                  pfVar1 = (float *)(lVar41 + lVar57 * (long)p_Var44);
                  fVar251 = *pfVar1;
                  fVar112 = pfVar1[1];
                  fVar113 = pfVar1[2];
                  uVar54 = (ulong)(-1 < (short)uVar8);
                  pfVar1 = (float *)(lVar41 + (uVar53 + uVar54 + 1) * (long)p_Var44);
                  lVar50 = uVar54 + lVar57;
                  uVar54 = 0;
                  if (-1 < (short)uVar9) {
                    uVar54 = uVar42;
                  }
                  pfVar2 = (float *)(lVar41 + lVar50 * (long)p_Var44);
                  fVar253 = *pfVar2;
                  fVar208 = pfVar2[1];
                  pfVar3 = (float *)(lVar41 + (uVar53 + uVar42 + uVar54) * (long)p_Var44);
                  fVar120 = pfVar3[1];
                  fVar121 = pfVar3[2];
                  pfVar4 = (float *)(lVar41 + (lVar57 + uVar54) * (long)p_Var44);
                  fVar118 = pfVar4[1];
                  fVar119 = pfVar4[2];
                  lVar41 = lVar41 + (uVar54 + lVar50) * (long)p_Var44;
                  fVar210 = *(float *)(lVar41 + 4);
                  uStack_11b8 = *(undefined4 *)(lVar41 + 8);
                  fStack_11b4 = fVar119;
                  fVar198 = *(float *)(ray + k * 4);
                  fVar225 = *(float *)(ray + k * 4 + 0x10);
                  local_13b8._0_4_ = *pfVar5 - fVar198;
                  local_13b8._4_4_ = fVar250 - fVar198;
                  fStack_13b0 = fVar251 - fVar198;
                  fStack_13ac = fVar187 - fVar198;
                  local_1218 = pfVar5[1] - fVar225;
                  fStack_1214 = local_11f8 - fVar225;
                  fStack_1210 = fVar112 - fVar225;
                  fStack_120c = fVar73 - fVar225;
                  local_11e8 = CONCAT44(*pfVar1,fVar250);
                  fVar250 = fVar250 - fVar198;
                  fVar252 = *pfVar1 - fVar198;
                  fVar254 = fVar253 - fVar198;
                  fVar255 = fVar251 - fVar198;
                  local_1208 = CONCAT44(fVar251,fVar187);
                  fVar187 = fVar187 - fVar198;
                  fVar196 = fVar251 - fVar198;
                  fVar197 = *pfVar4 - fVar198;
                  fVar198 = *pfVar3 - fVar198;
                  fStack_11f4 = pfVar1[1];
                  fStack_11f0 = fVar208;
                  fStack_11ec = fVar112;
                  fVar256 = local_11f8 - fVar225;
                  fVar259 = pfVar1[1] - fVar225;
                  fVar261 = fVar208 - fVar225;
                  fVar263 = fVar112 - fVar225;
                  fVar220 = fVar73 - fVar225;
                  fVar223 = fVar112 - fVar225;
                  fVar224 = fVar118 - fVar225;
                  fVar225 = fVar120 - fVar225;
                  fVar230 = *(float *)(ray + k * 4 + 0x20);
                  fVar242 = pfVar5[2] - fVar230;
                  fVar243 = fVar257 - fVar230;
                  fVar244 = fVar113 - fVar230;
                  fVar245 = fVar74 - fVar230;
                  local_11d8 = CONCAT44(pfVar1[2],fVar257);
                  local_11c8 = pfVar2[2];
                  fStack_11c4 = fVar113;
                  fVar257 = fVar257 - fVar230;
                  fVar260 = pfVar1[2] - fVar230;
                  fVar262 = pfVar2[2] - fVar230;
                  fVar264 = fVar113 - fVar230;
                  fVar226 = fVar74 - fVar230;
                  fVar228 = fVar113 - fVar230;
                  fVar229 = fVar119 - fVar230;
                  fVar230 = fVar121 - fVar230;
                  fVar199 = fVar187 - (float)local_13b8._0_4_;
                  fVar207 = fVar196 - (float)local_13b8._4_4_;
                  fVar209 = fVar197 - fStack_13b0;
                  fVar211 = fVar198 - fStack_13ac;
                  local_fa8 = fVar220 - local_1218;
                  fStack_fa4 = fVar223 - fStack_1214;
                  fStack_fa0 = fVar224 - fStack_1210;
                  fStack_f9c = fVar225 - fStack_120c;
                  local_f98 = fVar226 - fVar242;
                  fStack_f94 = fVar228 - fVar243;
                  fStack_f90 = fVar229 - fVar244;
                  fStack_f8c = fVar230 - fVar245;
                  local_1228 = fVar199;
                  fStack_1224 = fVar207;
                  fStack_1220 = fVar209;
                  fStack_121c = fVar211;
                  fVar219 = *(float *)(ray + k * 4 + 0x50);
                  local_fb8 = *(float *)(ray + k * 4 + 0x60);
                  fVar185 = *(float *)(ray + k * 4 + 0x40);
                  fVar146 = (local_fa8 * (fVar226 + fVar242) - (fVar220 + local_1218) * local_f98) *
                            fVar185 + ((fVar187 + (float)local_13b8._0_4_) * local_f98 -
                                      (fVar226 + fVar242) * fVar199) * fVar219 +
                                      (fVar199 * (fVar220 + local_1218) -
                                      (fVar187 + (float)local_13b8._0_4_) * local_fa8) * local_fb8;
                  fVar166 = (fStack_fa4 * (fVar228 + fVar243) - (fVar223 + fStack_1214) * fStack_f94
                            ) * fVar185 +
                            ((fVar196 + (float)local_13b8._4_4_) * fStack_f94 -
                            (fVar228 + fVar243) * fVar207) * fVar219 +
                            (fVar207 * (fVar223 + fStack_1214) -
                            (fVar196 + (float)local_13b8._4_4_) * fStack_fa4) * local_fb8;
                  fVar167 = (fStack_fa0 * (fVar229 + fVar244) - (fVar224 + fStack_1210) * fStack_f90
                            ) * fVar185 +
                            ((fVar197 + fStack_13b0) * fStack_f90 - (fVar229 + fVar244) * fVar209) *
                            fVar219 + (fVar209 * (fVar224 + fStack_1210) -
                                      (fVar197 + fStack_13b0) * fStack_fa0) * local_fb8;
                  fVar168 = (fStack_f9c * (fVar230 + fVar245) - (fVar225 + fStack_120c) * fStack_f8c
                            ) * fVar185 +
                            ((fVar198 + fStack_13ac) * fStack_f8c - (fVar230 + fVar245) * fVar211) *
                            fVar219 + (fVar211 * (fVar225 + fStack_120c) -
                                      (fVar198 + fStack_13ac) * fStack_f9c) * local_fb8;
                  fVar235 = (float)local_13b8._0_4_ - fVar250;
                  fVar239 = (float)local_13b8._4_4_ - fVar252;
                  fVar240 = fStack_13b0 - fVar254;
                  fVar241 = fStack_13ac - fVar255;
                  fVar169 = local_1218 - fVar256;
                  fVar183 = fStack_1214 - fVar259;
                  fVar184 = fStack_1210 - fVar261;
                  fVar186 = fStack_120c - fVar263;
                  local_fc8 = fVar242 - fVar257;
                  fStack_fc4 = fVar243 - fVar260;
                  fStack_fc0 = fVar244 - fVar262;
                  fStack_fbc = fVar245 - fVar264;
                  local_fd8._0_4_ =
                       (fVar169 * (fVar242 + fVar257) - (local_1218 + fVar256) * local_fc8) *
                       fVar185 + (((float)local_13b8._0_4_ + fVar250) * local_fc8 -
                                 (fVar242 + fVar257) * fVar235) * fVar219 +
                                 (fVar235 * (local_1218 + fVar256) -
                                 ((float)local_13b8._0_4_ + fVar250) * fVar169) * local_fb8;
                  local_fd8._4_4_ =
                       (fVar183 * (fVar243 + fVar260) - (fStack_1214 + fVar259) * fStack_fc4) *
                       fVar185 + (((float)local_13b8._4_4_ + fVar252) * fStack_fc4 -
                                 (fVar243 + fVar260) * fVar239) * fVar219 +
                                 (fVar239 * (fStack_1214 + fVar259) -
                                 ((float)local_13b8._4_4_ + fVar252) * fVar183) * local_fb8;
                  local_fd8._8_4_ =
                       (fVar184 * (fVar244 + fVar262) - (fStack_1210 + fVar261) * fStack_fc0) *
                       fVar185 + ((fStack_13b0 + fVar254) * fStack_fc0 -
                                 (fVar244 + fVar262) * fVar240) * fVar219 +
                                 (fVar240 * (fStack_1210 + fVar261) -
                                 (fStack_13b0 + fVar254) * fVar184) * local_fb8;
                  local_fd8._12_4_ =
                       (fVar186 * (fVar245 + fVar264) - (fStack_120c + fVar263) * fStack_fbc) *
                       fVar185 + ((fStack_13ac + fVar255) * fStack_fbc -
                                 (fVar245 + fVar264) * fVar241) * fVar219 +
                                 (fVar241 * (fStack_120c + fVar263) -
                                 (fStack_13ac + fVar255) * fVar186) * local_fb8;
                  fVar231 = fVar250 - fVar187;
                  fVar232 = fVar252 - fVar196;
                  fVar233 = fVar254 - fVar197;
                  fVar234 = fVar255 - fVar198;
                  fVar246 = fVar256 - fVar220;
                  fVar247 = fVar259 - fVar223;
                  fVar248 = fVar261 - fVar224;
                  fVar249 = fVar263 - fVar225;
                  fVar122 = fVar257 - fVar226;
                  fVar143 = fVar260 - fVar228;
                  fVar144 = fVar262 - fVar229;
                  fVar145 = fVar264 - fVar230;
                  fStack_fb4 = local_fb8;
                  fStack_fb0 = local_fb8;
                  fStack_fac = local_fb8;
                  auVar92._0_4_ =
                       (fVar246 * (fVar226 + fVar257) - (fVar220 + fVar256) * fVar122) * fVar185 +
                       ((fVar187 + fVar250) * fVar122 - (fVar226 + fVar257) * fVar231) * fVar219 +
                       (fVar231 * (fVar220 + fVar256) - (fVar187 + fVar250) * fVar246) * local_fb8;
                  auVar92._4_4_ =
                       (fVar247 * (fVar228 + fVar260) - (fVar223 + fVar259) * fVar143) * fVar185 +
                       ((fVar196 + fVar252) * fVar143 - (fVar228 + fVar260) * fVar232) * fVar219 +
                       (fVar232 * (fVar223 + fVar259) - (fVar196 + fVar252) * fVar247) * local_fb8;
                  auVar92._8_4_ =
                       (fVar248 * (fVar229 + fVar262) - (fVar224 + fVar261) * fVar144) * fVar185 +
                       ((fVar197 + fVar254) * fVar144 - (fVar229 + fVar262) * fVar233) * fVar219 +
                       (fVar233 * (fVar224 + fVar261) - (fVar197 + fVar254) * fVar248) * local_fb8;
                  auVar92._12_4_ =
                       (fVar249 * (fVar230 + fVar264) - (fVar225 + fVar263) * fVar145) * fVar185 +
                       ((fVar198 + fVar255) * fVar145 - (fVar230 + fVar264) * fVar234) * fVar219 +
                       (fVar234 * (fVar225 + fVar263) - (fVar198 + fVar255) * fVar249) * local_fb8;
                  auVar26._4_4_ = fVar166;
                  auVar26._0_4_ = fVar146;
                  auVar26._8_4_ = fVar167;
                  auVar26._12_4_ = fVar168;
                  fVar250 = fVar146 + local_fd8._0_4_ + auVar92._0_4_;
                  fVar257 = fVar166 + local_fd8._4_4_ + auVar92._4_4_;
                  fVar187 = fVar167 + local_fd8._8_4_ + auVar92._8_4_;
                  fVar198 = fVar168 + local_fd8._12_4_ + auVar92._12_4_;
                  auVar78 = minps(auVar26,local_fd8);
                  auVar78 = minps(auVar78,auVar92);
                  auVar124 = maxps(auVar26,local_fd8);
                  auVar124 = maxps(auVar124,auVar92);
                  local_fe8 = ABS(fVar250);
                  fStack_fe4 = ABS(fVar257);
                  fStack_fe0 = ABS(fVar187);
                  fStack_fdc = ABS(fVar198);
                  auVar191._4_4_ = -(uint)(auVar124._4_4_ <= fStack_fe4 * 1.1920929e-07);
                  auVar191._0_4_ = -(uint)(auVar124._0_4_ <= local_fe8 * 1.1920929e-07);
                  auVar191._8_4_ = -(uint)(auVar124._8_4_ <= fStack_fe0 * 1.1920929e-07);
                  auVar191._12_4_ = -(uint)(auVar124._12_4_ <= fStack_fdc * 1.1920929e-07);
                  auVar152._4_4_ = -(uint)(-(fStack_fe4 * 1.1920929e-07) <= auVar78._4_4_);
                  auVar152._0_4_ = -(uint)(-(local_fe8 * 1.1920929e-07) <= auVar78._0_4_);
                  auVar152._8_4_ = -(uint)(-(fStack_fe0 * 1.1920929e-07) <= auVar78._8_4_);
                  auVar152._12_4_ = -(uint)(-(fStack_fdc * 1.1920929e-07) <= auVar78._12_4_);
                  auVar191 = auVar191 | auVar152;
                  uVar37 = movmskps(uVar37,auVar191);
                  local_1258 = ZEXT416(uVar45);
                  local_1268 = ZEXT416(uVar46);
                  local_1088 = ZEXT416(uVar36);
                  local_1098 = ZEXT416(uVar39);
                  local_13c0 = uVar52;
                  if (uVar37 != 0) {
                    local_1228 = fVar250;
                    fStack_1224 = fVar257;
                    fStack_1220 = fVar187;
                    fStack_121c = fVar198;
                    uVar58 = -(uint)(ABS(fVar246 * local_fc8) <= ABS(fVar169 * local_f98));
                    uVar61 = -(uint)(ABS(fVar247 * fStack_fc4) <= ABS(fVar183 * fStack_f94));
                    uVar64 = -(uint)(ABS(fVar248 * fStack_fc0) <= ABS(fVar184 * fStack_f90));
                    uVar67 = -(uint)(ABS(fVar249 * fStack_fbc) <= ABS(fVar186 * fStack_f8c));
                    uVar59 = -(uint)(ABS(fVar235 * fVar122) <= ABS(fVar199 * local_fc8));
                    uVar62 = -(uint)(ABS(fVar239 * fVar143) <= ABS(fVar207 * fStack_fc4));
                    uVar65 = -(uint)(ABS(fVar240 * fVar144) <= ABS(fVar209 * fStack_fc0));
                    uVar68 = -(uint)(ABS(fVar241 * fVar145) <= ABS(fVar211 * fStack_fbc));
                    uVar60 = -(uint)(ABS(fVar231 * fVar169) <= ABS(fVar235 * local_fa8));
                    uVar63 = -(uint)(ABS(fVar232 * fVar183) <= ABS(fVar239 * fStack_fa4));
                    uVar66 = -(uint)(ABS(fVar233 * fVar184) <= ABS(fVar240 * fStack_fa0));
                    uVar69 = -(uint)(ABS(fVar234 * fVar186) <= ABS(fVar241 * fStack_f9c));
                    local_12a8._0_4_ =
                         ~uVar58 & (uint)(local_fa8 * local_fc8 - fVar169 * local_f98) |
                         (uint)(fVar169 * fVar122 - fVar246 * local_fc8) & uVar58;
                    local_12a8._4_4_ =
                         ~uVar61 & (uint)(fStack_fa4 * fStack_fc4 - fVar183 * fStack_f94) |
                         (uint)(fVar183 * fVar143 - fVar247 * fStack_fc4) & uVar61;
                    fStack_12a0 = (float)(~uVar64 & (uint)(fStack_fa0 * fStack_fc0 -
                                                          fVar184 * fStack_f90) |
                                         (uint)(fVar184 * fVar144 - fVar248 * fStack_fc0) & uVar64);
                    fStack_129c = (float)(~uVar67 & (uint)(fStack_f9c * fStack_fbc -
                                                          fVar186 * fStack_f8c) |
                                         (uint)(fVar186 * fVar145 - fVar249 * fStack_fbc) & uVar67);
                    auVar28._4_4_ = fVar257;
                    auVar28._0_4_ = fVar250;
                    auVar28._8_4_ = fVar187;
                    auVar28._12_4_ = fVar198;
                    local_1298._0_4_ =
                         ~uVar59 & (uint)(local_f98 * fVar235 - fVar199 * local_fc8) |
                         (uint)(fVar231 * local_fc8 - fVar235 * fVar122) & uVar59;
                    local_1298._4_4_ =
                         ~uVar62 & (uint)(fStack_f94 * fVar239 - fVar207 * fStack_fc4) |
                         (uint)(fVar232 * fStack_fc4 - fVar239 * fVar143) & uVar62;
                    fStack_1290 = (float)(~uVar65 & (uint)(fStack_f90 * fVar240 -
                                                          fVar209 * fStack_fc0) |
                                         (uint)(fVar233 * fStack_fc0 - fVar240 * fVar144) & uVar65);
                    fStack_128c = (float)(~uVar68 & (uint)(fStack_f8c * fVar241 -
                                                          fVar211 * fStack_fbc) |
                                         (uint)(fVar234 * fStack_fbc - fVar241 * fVar145) & uVar68);
                    local_1288[0] =
                         (float)(~uVar60 & (uint)(fVar199 * fVar169 - fVar235 * local_fa8) |
                                (uint)(fVar235 * fVar246 - fVar231 * fVar169) & uVar60);
                    local_1288[1] =
                         (float)(~uVar63 & (uint)(fVar207 * fVar183 - fVar239 * fStack_fa4) |
                                (uint)(fVar239 * fVar247 - fVar232 * fVar183) & uVar63);
                    local_1288[2] =
                         (float)(~uVar66 & (uint)(fVar209 * fVar184 - fVar240 * fStack_fa0) |
                                (uint)(fVar240 * fVar248 - fVar233 * fVar184) & uVar66);
                    local_1288[3] =
                         (float)(~uVar69 & (uint)(fVar211 * fVar186 - fVar241 * fStack_f9c) |
                                (uint)(fVar241 * fVar249 - fVar234 * fVar186) & uVar69);
                    fVar225 = fVar185 * (float)local_12a8._0_4_ +
                              fVar219 * (float)local_1298._0_4_ + local_fb8 * local_1288[0];
                    fVar230 = fVar185 * (float)local_12a8._4_4_ +
                              fVar219 * (float)local_1298._4_4_ + local_fb8 * local_1288[1];
                    fVar122 = fVar185 * fStack_12a0 +
                              fVar219 * fStack_1290 + local_fb8 * local_1288[2];
                    fVar219 = fVar185 * fStack_129c +
                              fVar219 * fStack_128c + local_fb8 * local_1288[3];
                    auVar213._0_4_ = fVar225 + fVar225;
                    auVar213._4_4_ = fVar230 + fVar230;
                    auVar213._8_4_ = fVar122 + fVar122;
                    auVar213._12_4_ = fVar219 + fVar219;
                    auVar129._0_4_ = local_1218 * (float)local_1298._0_4_ + fVar242 * local_1288[0];
                    auVar129._4_4_ = fStack_1214 * (float)local_1298._4_4_ + fVar243 * local_1288[1]
                    ;
                    auVar129._8_4_ = fStack_1210 * fStack_1290 + fVar244 * local_1288[2];
                    auVar129._12_4_ = fStack_120c * fStack_128c + fVar245 * local_1288[3];
                    fVar122 = (float)local_13b8._0_4_ * (float)local_12a8._0_4_ + auVar129._0_4_;
                    fVar143 = (float)local_13b8._4_4_ * (float)local_12a8._4_4_ + auVar129._4_4_;
                    fVar144 = fStack_13b0 * fStack_12a0 + auVar129._8_4_;
                    fVar145 = fStack_13ac * fStack_129c + auVar129._12_4_;
                    auVar78 = rcpps(auVar129,auVar213);
                    fVar225 = auVar78._0_4_;
                    fVar230 = auVar78._4_4_;
                    fVar219 = auVar78._8_4_;
                    fVar185 = auVar78._12_4_;
                    local_12b8._0_4_ =
                         ((1.0 - auVar213._0_4_ * fVar225) * fVar225 + fVar225) *
                         (fVar122 + fVar122);
                    local_12b8._4_4_ =
                         ((1.0 - auVar213._4_4_ * fVar230) * fVar230 + fVar230) *
                         (fVar143 + fVar143);
                    fStack_12b0 = ((1.0 - auVar213._8_4_ * fVar219) * fVar219 + fVar219) *
                                  (fVar144 + fVar144);
                    fStack_12ac = ((1.0 - auVar213._12_4_ * fVar185) * fVar185 + fVar185) *
                                  (fVar145 + fVar145);
                    fVar225 = *(float *)(ray + k * 4 + 0x30);
                    auVar130._0_4_ =
                         -(uint)((float)local_12b8._0_4_ <= fVar72 &&
                                fVar225 <= (float)local_12b8._0_4_) & auVar191._0_4_;
                    auVar130._4_4_ =
                         -(uint)((float)local_12b8._4_4_ <= fVar72 &&
                                fVar225 <= (float)local_12b8._4_4_) & auVar191._4_4_;
                    auVar130._8_4_ =
                         -(uint)(fStack_12b0 <= fVar72 && fVar225 <= fStack_12b0) & auVar191._8_4_;
                    auVar130._12_4_ =
                         -(uint)(fStack_12ac <= fVar72 && fVar225 <= fStack_12ac) & auVar191._12_4_;
                    uVar37 = movmskps(uVar37,auVar130);
                    if (uVar37 != 0) {
                      uVar58 = -(uint)(auVar213._4_4_ != 0.0);
                      uVar59 = -(uint)(auVar213._8_4_ != 0.0);
                      uVar60 = -(uint)(auVar213._12_4_ != 0.0);
                      auVar214._4_4_ = uVar58;
                      auVar214._0_4_ = -(uint)(auVar213._0_4_ != 0.0);
                      auVar214._8_4_ = uVar59;
                      auVar214._12_4_ = uVar60;
                      valid.field_0.i[0] = auVar130._0_4_ & -(uint)(auVar213._0_4_ != 0.0);
                      valid.field_0.i[1] = auVar130._4_4_ & uVar58;
                      valid.field_0.i[2] = auVar130._8_4_ & uVar59;
                      valid.field_0.i[3] = auVar130._12_4_ & uVar60;
                      uVar37 = movmskps(uVar37,(undefined1  [16])valid.field_0);
                      if (uVar37 != 0) {
                        auVar131._4_12_ = valid.field_0._4_12_;
                        auVar131._0_4_ = (float)(int)(*(ushort *)(lVar13 + 8 + lVar56) - 1);
                        auVar192._4_4_ = valid.field_0.i[1];
                        auVar192._0_4_ = auVar131._0_4_;
                        auVar192._8_4_ = valid.field_0.i[2];
                        auVar192._12_4_ = valid.field_0.i[3];
                        auVar78 = rcpss(auVar192,auVar131);
                        auVar215._4_12_ = auVar214._4_12_;
                        auVar215._0_4_ = (float)(int)(*(ushort *)(lVar13 + 10 + lVar56) - 1);
                        fVar72 = (2.0 - auVar131._0_4_ * auVar78._0_4_) * auVar78._0_4_;
                        auVar193._4_4_ = uVar58;
                        auVar193._0_4_ = auVar215._0_4_;
                        auVar193._8_4_ = uVar59;
                        auVar193._12_4_ = uVar60;
                        auVar78 = rcpss(auVar193,auVar215);
                        fVar225 = (2.0 - auVar215._0_4_ * auVar78._0_4_) * auVar78._0_4_;
                        auVar176._0_4_ = (float)uVar45 * fVar250 + fVar146;
                        auVar176._4_4_ = (float)(uVar45 + 1) * fVar257 + fVar166;
                        auVar176._8_4_ = (float)(uVar45 + 1) * fVar187 + fVar167;
                        auVar176._12_4_ = (float)uVar45 * fVar198 + fVar168;
                        tNear.field_0.v[1] = fVar72 * auVar176._4_4_;
                        tNear.field_0.v[0] = fVar72 * auVar176._0_4_;
                        tNear.field_0.v[2] = fVar72 * auVar176._8_4_;
                        tNear.field_0.v[3] = fVar72 * auVar176._12_4_;
                        pGVar12 = (local_1128->geometries).items[uVar52].ptr;
                        uVar37 = *(uint *)(ray + k * 4 + 0x90);
                        if ((pGVar12->mask & uVar37) != 0) {
                          auVar78 = rcpps(auVar176,auVar28);
                          fVar230 = auVar78._0_4_;
                          fVar219 = auVar78._4_4_;
                          fVar185 = auVar78._8_4_;
                          fVar122 = auVar78._12_4_;
                          fVar230 = (float)(-(uint)(1e-18 <= local_fe8) &
                                           (uint)(((float)DAT_01feca10 - fVar250 * fVar230) *
                                                  fVar230 + fVar230));
                          fVar219 = (float)(-(uint)(1e-18 <= fStack_fe4) &
                                           (uint)((DAT_01feca10._4_4_ - fVar257 * fVar219) * fVar219
                                                 + fVar219));
                          fVar185 = (float)(-(uint)(1e-18 <= fStack_fe0) &
                                           (uint)((DAT_01feca10._8_4_ - fVar187 * fVar185) * fVar185
                                                 + fVar185));
                          fVar122 = (float)(-(uint)(1e-18 <= fStack_fdc) &
                                           (uint)((DAT_01feca10._12_4_ - fVar198 * fVar122) *
                                                  fVar122 + fVar122));
                          auVar93._0_4_ = fVar72 * auVar176._0_4_ * fVar230;
                          auVar93._4_4_ = fVar72 * auVar176._4_4_ * fVar219;
                          auVar93._8_4_ = fVar72 * auVar176._8_4_ * fVar185;
                          auVar93._12_4_ = fVar72 * auVar176._12_4_ * fVar122;
                          local_12d8 = minps(auVar93,_DAT_01feca10);
                          auVar132._0_4_ =
                               fVar225 * ((float)uVar46 * fVar250 + local_fd8._0_4_) * fVar230;
                          auVar132._4_4_ =
                               fVar225 * ((float)uVar46 * fVar257 + local_fd8._4_4_) * fVar219;
                          auVar132._8_4_ =
                               fVar225 * ((float)(uVar46 + 1) * fVar187 + local_fd8._8_4_) * fVar185
                          ;
                          auVar132._12_4_ =
                               fVar225 * ((float)(uVar46 + 1) * fVar198 + local_fd8._12_4_) *
                               fVar122;
                          local_12c8 = minps(auVar132,_DAT_01feca10);
                          auVar124 = ~(undefined1  [16])valid.field_0 & _DAT_01feb9f0 |
                                     _local_12b8 & (undefined1  [16])valid.field_0;
                          auVar177._4_4_ = auVar124._0_4_;
                          auVar177._0_4_ = auVar124._4_4_;
                          auVar177._8_4_ = auVar124._12_4_;
                          auVar177._12_4_ = auVar124._8_4_;
                          auVar78 = minps(auVar177,auVar124);
                          auVar94._0_8_ = auVar78._8_8_;
                          auVar94._8_4_ = auVar78._0_4_;
                          auVar94._12_4_ = auVar78._4_4_;
                          auVar78 = minps(auVar94,auVar78);
                          auVar95._0_8_ =
                               CONCAT44(-(uint)(auVar78._4_4_ == auVar124._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar78._0_4_ == auVar124._0_4_) &
                                        valid.field_0.i[0]);
                          auVar95._8_4_ =
                               -(uint)(auVar78._8_4_ == auVar124._8_4_) & valid.field_0.i[2];
                          auVar95._12_4_ =
                               -(uint)(auVar78._12_4_ == auVar124._12_4_) & valid.field_0.i[3];
                          iVar38 = movmskps(uVar37,auVar95);
                          aVar153 = valid.field_0;
                          if (iVar38 != 0) {
                            aVar153.i[2] = auVar95._8_4_;
                            aVar153._0_8_ = auVar95._0_8_;
                            aVar153.i[3] = auVar95._12_4_;
                          }
                          uVar37 = movmskps(iVar38,(undefined1  [16])aVar153);
                          lVar41 = 0;
                          if (uVar37 != 0) {
                            for (; (uVar37 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                            }
                          }
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar48 = *(undefined4 *)(local_12d8 + lVar41 * 4);
                            uVar35 = *(undefined4 *)(local_12c8 + lVar41 * 4);
                            uVar6 = *(undefined4 *)(local_12a8 + lVar41 * 4);
                            fVar72 = local_1288[lVar41 + -4];
                            fVar250 = local_1288[lVar41];
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_12b8 + lVar41 * 4);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                            *(float *)(ray + k * 4 + 0xd0) = fVar72;
                            *(float *)(ray + k * 4 + 0xe0) = fVar250;
                            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar48;
                            *(undefined4 *)(ray + k * 4 + 0x100) = uVar35;
                            *(uint *)(ray + k * 4 + 0x110) = uVar39;
                            *(uint *)(ray + k * 4 + 0x120) = uVar36;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            uVar37 = context->user->instPrimID[0];
                            *(uint *)(ray + k * 4 + 0x140) = uVar37;
                          }
                          else {
                            local_1368 = CONCAT44(uVar39,uVar39);
                            uStack_1360._0_4_ = uVar39;
                            uStack_1360._4_4_ = uVar39;
                            uVar7 = *(undefined8 *)(mm_lookupmask_ps + lVar40);
                            uVar25 = *(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
                            local_13b8 = auVar51;
                            do {
                              uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
                              local_1048 = *(undefined4 *)(local_12d8 + lVar41 * 4);
                              local_1038 = *(undefined4 *)(local_12c8 + lVar41 * 4);
                              *(undefined4 *)(ray + k * 4 + 0x80) =
                                   *(undefined4 *)(local_12b8 + lVar41 * 4);
                              args.context = context->user;
                              local_1078 = *(undefined4 *)(local_12a8 + lVar41 * 4);
                              local_1068._4_4_ = local_1288[lVar41 + -4];
                              local_1058._4_4_ = local_1288[lVar41];
                              uStack_1074 = local_1078;
                              uStack_1070 = local_1078;
                              uStack_106c = local_1078;
                              local_1068._0_4_ = local_1068._4_4_;
                              fStack_1060 = (float)local_1068._4_4_;
                              fStack_105c = (float)local_1068._4_4_;
                              local_1058._0_4_ = local_1058._4_4_;
                              fStack_1050 = (float)local_1058._4_4_;
                              fStack_104c = (float)local_1058._4_4_;
                              uStack_1044 = local_1048;
                              uStack_1040 = local_1048;
                              uStack_103c = local_1048;
                              uStack_1034 = local_1038;
                              uStack_1030 = local_1038;
                              uStack_102c = local_1038;
                              local_1028 = local_1368;
                              uStack_1020 = uStack_1360;
                              local_1018 = CONCAT44(uVar36,uVar36);
                              uStack_1010 = CONCAT44(uVar36,uVar36);
                              local_1008 = (args.context)->instID[0];
                              uStack_1004 = local_1008;
                              uStack_1000 = local_1008;
                              uStack_ffc = local_1008;
                              local_ff8 = (args.context)->instPrimID[0];
                              uStack_ff4 = local_ff8;
                              uStack_ff0 = local_ff8;
                              uStack_fec = local_ff8;
                              args.valid = (int *)&local_13d8;
                              pRVar49 = (RTCIntersectArguments *)pGVar12->userPtr;
                              args.hit = (RTCHitN *)&local_1078;
                              args.N = 4;
                              p_Var44 = pGVar12->intersectionFilterN;
                              local_13d8 = uVar7;
                              uStack_13d0 = uVar25;
                              args.geometryUserPtr = pRVar49;
                              args.ray = (RTCRayN *)ray;
                              if (p_Var44 != (RTCFilterFunctionN)0x0) {
                                p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                                uVar52 = local_13c0;
                                auVar51 = local_13b8;
                              }
                              auVar100._0_4_ = -(uint)((int)local_13d8 == 0);
                              auVar100._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                              auVar100._8_4_ = -(uint)((int)uStack_13d0 == 0);
                              auVar100._12_4_ = -(uint)(uStack_13d0._4_4_ == 0);
                              uVar39 = movmskps((int)p_Var44,auVar100);
                              pRVar43 = (RTCRayN *)(ulong)(uVar39 ^ 0xf);
                              if ((uVar39 ^ 0xf) == 0) {
                                auVar100 = auVar100 ^ _DAT_01febe20;
                              }
                              else {
                                pRVar49 = context->args;
                                p_Var44 = pRVar49->filter;
                                if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar49->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                                  p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                                  uVar52 = local_13c0;
                                  auVar51 = local_13b8;
                                }
                                auVar135._0_4_ = -(uint)((int)local_13d8 == 0);
                                auVar135._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                                auVar135._8_4_ = -(uint)((int)uStack_13d0 == 0);
                                auVar135._12_4_ = -(uint)(uStack_13d0._4_4_ == 0);
                                auVar100 = auVar135 ^ _DAT_01febe20;
                                uVar39 = movmskps((int)p_Var44,auVar135);
                                pRVar43 = (RTCRayN *)(ulong)(uVar39 ^ 0xf);
                                if ((uVar39 ^ 0xf) != 0) {
                                  auVar158._0_4_ = *(uint *)(args.ray + 0xc0) & auVar135._0_4_;
                                  auVar158._4_4_ = *(uint *)(args.ray + 0xc4) & auVar135._4_4_;
                                  auVar158._8_4_ = *(uint *)(args.ray + 200) & auVar135._8_4_;
                                  auVar158._12_4_ = *(uint *)(args.ray + 0xcc) & auVar135._12_4_;
                                  auVar217._0_4_ = ~auVar135._0_4_ & *(uint *)args.hit;
                                  auVar217._4_4_ = ~auVar135._4_4_ & *(uint *)(args.hit + 4);
                                  auVar217._8_4_ = ~auVar135._8_4_ & *(uint *)(args.hit + 8);
                                  auVar217._12_4_ = ~auVar135._12_4_ & *(uint *)(args.hit + 0xc);
                                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar217 | auVar158;
                                  uVar39 = *(uint *)(args.hit + 0x14);
                                  uVar37 = *(uint *)(args.hit + 0x18);
                                  uVar45 = *(uint *)(args.hit + 0x1c);
                                  *(uint *)(args.ray + 0xd0) =
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x10) |
                                       *(uint *)(args.ray + 0xd0) & auVar135._0_4_;
                                  *(uint *)(args.ray + 0xd4) =
                                       ~auVar135._4_4_ & uVar39 |
                                       *(uint *)(args.ray + 0xd4) & auVar135._4_4_;
                                  *(uint *)(args.ray + 0xd8) =
                                       ~auVar135._8_4_ & uVar37 |
                                       *(uint *)(args.ray + 0xd8) & auVar135._8_4_;
                                  *(uint *)(args.ray + 0xdc) =
                                       ~auVar135._12_4_ & uVar45 |
                                       *(uint *)(args.ray + 0xdc) & auVar135._12_4_;
                                  uVar39 = *(uint *)(args.hit + 0x24);
                                  uVar37 = *(uint *)(args.hit + 0x28);
                                  uVar45 = *(uint *)(args.hit + 0x2c);
                                  *(uint *)(args.ray + 0xe0) =
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x20) |
                                       *(uint *)(args.ray + 0xe0) & auVar135._0_4_;
                                  *(uint *)(args.ray + 0xe4) =
                                       ~auVar135._4_4_ & uVar39 |
                                       *(uint *)(args.ray + 0xe4) & auVar135._4_4_;
                                  *(uint *)(args.ray + 0xe8) =
                                       ~auVar135._8_4_ & uVar37 |
                                       *(uint *)(args.ray + 0xe8) & auVar135._8_4_;
                                  *(uint *)(args.ray + 0xec) =
                                       ~auVar135._12_4_ & uVar45 |
                                       *(uint *)(args.ray + 0xec) & auVar135._12_4_;
                                  auVar205._0_4_ = *(uint *)(args.ray + 0xf0) & auVar135._0_4_;
                                  auVar205._4_4_ = *(uint *)(args.ray + 0xf4) & auVar135._4_4_;
                                  auVar205._8_4_ = *(uint *)(args.ray + 0xf8) & auVar135._8_4_;
                                  auVar205._12_4_ = *(uint *)(args.ray + 0xfc) & auVar135._12_4_;
                                  auVar159._0_4_ = ~auVar135._0_4_ & *(uint *)(args.hit + 0x30);
                                  auVar159._4_4_ = ~auVar135._4_4_ & *(uint *)(args.hit + 0x34);
                                  auVar159._8_4_ = ~auVar135._8_4_ & *(uint *)(args.hit + 0x38);
                                  auVar159._12_4_ = ~auVar135._12_4_ & *(uint *)(args.hit + 0x3c);
                                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar159 | auVar205;
                                  uVar39 = *(uint *)(args.hit + 0x44);
                                  uVar37 = *(uint *)(args.hit + 0x48);
                                  uVar45 = *(uint *)(args.hit + 0x4c);
                                  *(uint *)(args.ray + 0x100) =
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x40) |
                                       *(uint *)(args.ray + 0x100) & auVar135._0_4_;
                                  *(uint *)(args.ray + 0x104) =
                                       ~auVar135._4_4_ & uVar39 |
                                       *(uint *)(args.ray + 0x104) & auVar135._4_4_;
                                  *(uint *)(args.ray + 0x108) =
                                       ~auVar135._8_4_ & uVar37 |
                                       *(uint *)(args.ray + 0x108) & auVar135._8_4_;
                                  *(uint *)(args.ray + 0x10c) =
                                       ~auVar135._12_4_ & uVar45 |
                                       *(uint *)(args.ray + 0x10c) & auVar135._12_4_;
                                  uVar39 = *(uint *)(args.hit + 0x54);
                                  uVar37 = *(uint *)(args.hit + 0x58);
                                  uVar45 = *(uint *)(args.hit + 0x5c);
                                  *(uint *)(args.ray + 0x110) =
                                       *(uint *)(args.ray + 0x110) & auVar135._0_4_ |
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x50);
                                  *(uint *)(args.ray + 0x114) =
                                       *(uint *)(args.ray + 0x114) & auVar135._4_4_ |
                                       ~auVar135._4_4_ & uVar39;
                                  *(uint *)(args.ray + 0x118) =
                                       *(uint *)(args.ray + 0x118) & auVar135._8_4_ |
                                       ~auVar135._8_4_ & uVar37;
                                  *(uint *)(args.ray + 0x11c) =
                                       *(uint *)(args.ray + 0x11c) & auVar135._12_4_ |
                                       ~auVar135._12_4_ & uVar45;
                                  uVar39 = *(uint *)(args.hit + 100);
                                  uVar37 = *(uint *)(args.hit + 0x68);
                                  uVar45 = *(uint *)(args.hit + 0x6c);
                                  *(uint *)(args.ray + 0x120) =
                                       *(uint *)(args.ray + 0x120) & auVar135._0_4_ |
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x60);
                                  *(uint *)(args.ray + 0x124) =
                                       *(uint *)(args.ray + 0x124) & auVar135._4_4_ |
                                       ~auVar135._4_4_ & uVar39;
                                  *(uint *)(args.ray + 0x128) =
                                       *(uint *)(args.ray + 0x128) & auVar135._8_4_ |
                                       ~auVar135._8_4_ & uVar37;
                                  *(uint *)(args.ray + 300) =
                                       *(uint *)(args.ray + 300) & auVar135._12_4_ |
                                       ~auVar135._12_4_ & uVar45;
                                  uVar39 = *(uint *)(args.hit + 0x74);
                                  uVar37 = *(uint *)(args.hit + 0x78);
                                  uVar45 = *(uint *)(args.hit + 0x7c);
                                  *(uint *)(args.ray + 0x130) =
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x70) |
                                       *(uint *)(args.ray + 0x130) & auVar135._0_4_;
                                  *(uint *)(args.ray + 0x134) =
                                       ~auVar135._4_4_ & uVar39 |
                                       *(uint *)(args.ray + 0x134) & auVar135._4_4_;
                                  *(uint *)(args.ray + 0x138) =
                                       ~auVar135._8_4_ & uVar37 |
                                       *(uint *)(args.ray + 0x138) & auVar135._8_4_;
                                  *(uint *)(args.ray + 0x13c) =
                                       ~auVar135._12_4_ & uVar45 |
                                       *(uint *)(args.ray + 0x13c) & auVar135._12_4_;
                                  uVar39 = *(uint *)(args.hit + 0x84);
                                  uVar37 = *(uint *)(args.hit + 0x88);
                                  uVar45 = *(uint *)(args.hit + 0x8c);
                                  *(uint *)(args.ray + 0x140) =
                                       ~auVar135._0_4_ & *(uint *)(args.hit + 0x80) |
                                       *(uint *)(args.ray + 0x140) & auVar135._0_4_;
                                  *(uint *)(args.ray + 0x144) =
                                       ~auVar135._4_4_ & uVar39 |
                                       *(uint *)(args.ray + 0x144) & auVar135._4_4_;
                                  *(uint *)(args.ray + 0x148) =
                                       ~auVar135._8_4_ & uVar37 |
                                       *(uint *)(args.ray + 0x148) & auVar135._8_4_;
                                  *(uint *)(args.ray + 0x14c) =
                                       ~auVar135._12_4_ & uVar45 |
                                       *(uint *)(args.ray + 0x14c) & auVar135._12_4_;
                                  pRVar43 = args.ray;
                                  pRVar49 = (RTCIntersectArguments *)args.hit;
                                }
                              }
                              uVar39 = SUB84(auVar51,0);
                              auVar101._0_4_ = auVar100._0_4_ << 0x1f;
                              auVar101._4_4_ = auVar100._4_4_ << 0x1f;
                              auVar101._8_4_ = auVar100._8_4_ << 0x1f;
                              auVar101._12_4_ = auVar100._12_4_ << 0x1f;
                              iVar38 = movmskps((int)pRVar43,auVar101);
                              if (iVar38 == 0) {
                                *(undefined4 *)(ray + k * 4 + 0x80) = uVar35;
                              }
                              valid.field_0.v[lVar41] = 0.0;
                              fVar72 = *(float *)(ray + k * 4 + 0x80);
                              valid.field_0.i[0] =
                                   -(uint)((float)local_12b8._0_4_ <= fVar72) & valid.field_0.i[0];
                              valid.field_0.i[1] =
                                   -(uint)((float)local_12b8._4_4_ <= fVar72) & valid.field_0.i[1];
                              valid.field_0.i[2] =
                                   -(uint)(fStack_12b0 <= fVar72) & valid.field_0.i[2];
                              valid.field_0.i[3] =
                                   -(uint)(fStack_12ac <= fVar72) & valid.field_0.i[3];
                              uVar37 = movmskps(iVar38,(undefined1  [16])valid.field_0);
                              if (uVar37 != 0) {
                                auVar136._0_4_ = local_12b8._0_4_ & valid.field_0.i[0];
                                auVar136._4_4_ = local_12b8._4_4_ & valid.field_0.i[1];
                                auVar136._8_4_ = (uint)fStack_12b0 & valid.field_0.i[2];
                                auVar136._12_4_ = (uint)fStack_12ac & valid.field_0.i[3];
                                auVar160._0_8_ =
                                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                     0x7f8000007f800000;
                                auVar160._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                                auVar160._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                                auVar160 = auVar160 | auVar136;
                                auVar180._4_4_ = auVar160._0_4_;
                                auVar180._0_4_ = auVar160._4_4_;
                                auVar180._8_4_ = auVar160._12_4_;
                                auVar180._12_4_ = auVar160._8_4_;
                                auVar78 = minps(auVar180,auVar160);
                                auVar137._0_8_ = auVar78._8_8_;
                                auVar137._8_4_ = auVar78._0_4_;
                                auVar137._12_4_ = auVar78._4_4_;
                                auVar78 = minps(auVar137,auVar78);
                                auVar138._0_8_ =
                                     CONCAT44(-(uint)(auVar78._4_4_ == auVar160._4_4_) &
                                              valid.field_0.i[1],
                                              -(uint)(auVar78._0_4_ == auVar160._0_4_) &
                                              valid.field_0.i[0]);
                                auVar138._8_4_ =
                                     -(uint)(auVar78._8_4_ == auVar160._8_4_) & valid.field_0.i[2];
                                auVar138._12_4_ =
                                     -(uint)(auVar78._12_4_ == auVar160._12_4_) & valid.field_0.i[3]
                                ;
                                iVar38 = movmskps((int)pRVar49,auVar138);
                                aVar102 = valid.field_0;
                                if (iVar38 != 0) {
                                  aVar102.i[2] = auVar138._8_4_;
                                  aVar102._0_8_ = auVar138._0_8_;
                                  aVar102.i[3] = auVar138._12_4_;
                                }
                                uVar35 = movmskps(iVar38,(undefined1  [16])aVar102);
                                uVar54 = CONCAT44((int)((ulong)pRVar49 >> 0x20),uVar35);
                                lVar41 = 0;
                                if (uVar54 != 0) {
                                  for (; (uVar54 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                                  }
                                }
                              }
                            } while ((char)uVar37 != '\0');
                          }
                        }
                      }
                    }
                  }
                  fVar72 = *(float *)(ray + k * 4);
                  fVar250 = *(float *)(ray + k * 4 + 0x10);
                  fVar257 = *(float *)(ray + k * 4 + 0x20);
                  fVar187 = *(float *)(ray + k * 4 + 0x40);
                  fVar198 = *(float *)(ray + k * 4 + 0x50);
                  fVar251 = fVar251 - fVar72;
                  fVar253 = fVar253 - fVar72;
                  fStack_1340 = fStack_1340 - fVar72;
                  fStack_133c = fStack_133c - fVar72;
                  fVar168 = fVar112 - fVar250;
                  fVar208 = fVar208 - fVar250;
                  fVar210 = fVar210 - fVar250;
                  fVar169 = fVar118 - fVar250;
                  local_11c8 = local_11c8 - fVar257;
                  fStack_11c4 = fStack_11c4 - fVar257;
                  fStack_11c0 = fStack_11c0 - fVar257;
                  fStack_11bc = fStack_11bc - fVar257;
                  fVar231 = (float)local_1208 - fVar72;
                  fVar232 = local_1208._4_4_ - fVar72;
                  fVar233 = fStack_1200 - fVar72;
                  fVar234 = fStack_11fc - fVar72;
                  fVar73 = fVar73 - fVar250;
                  fVar112 = fVar112 - fVar250;
                  fVar118 = fVar118 - fVar250;
                  fVar120 = fVar120 - fVar250;
                  fVar74 = fVar74 - fVar257;
                  fVar113 = fVar113 - fVar257;
                  fVar119 = fVar119 - fVar257;
                  fVar121 = fVar121 - fVar257;
                  fVar249 = (float)local_11e8 - fVar72;
                  fVar252 = local_11e8._4_4_ - fVar72;
                  fVar254 = fStack_11e0 - fVar72;
                  fVar72 = fStack_11dc - fVar72;
                  fVar242 = local_11f8 - fVar250;
                  fVar243 = fStack_11f4 - fVar250;
                  fVar244 = fStack_11f0 - fVar250;
                  fVar250 = fStack_11ec - fVar250;
                  fVar223 = (float)local_11d8 - fVar257;
                  fVar224 = local_11d8._4_4_ - fVar257;
                  fVar226 = fStack_11d0 - fVar257;
                  fVar257 = fStack_11cc - fVar257;
                  fVar230 = fVar249 - fVar251;
                  fVar185 = fVar252 - fVar253;
                  fStack_11d0 = fVar254 - fStack_1340;
                  fStack_11cc = fVar72 - fStack_133c;
                  local_11f8 = fVar242 - fVar168;
                  fStack_11f4 = fVar243 - fVar208;
                  fStack_11f0 = fVar244 - fVar210;
                  fStack_11ec = fVar250 - fVar169;
                  fVar183 = fVar223 - local_11c8;
                  fVar186 = fVar224 - fStack_11c4;
                  fStack_11e0 = fVar226 - fStack_11c0;
                  fStack_11dc = fVar257 - fStack_11bc;
                  local_11d8 = CONCAT44(fVar185,fVar230);
                  local_11e8 = CONCAT44(fVar186,fVar183);
                  fVar225 = *(float *)(ray + k * 4 + 0x60);
                  fVar145 = fVar251 - fVar231;
                  fVar146 = fVar253 - fVar232;
                  fVar166 = fStack_1340 - fVar233;
                  fVar167 = fStack_133c - fVar234;
                  fVar219 = fVar168 - fVar73;
                  fVar122 = fVar208 - fVar112;
                  fVar143 = fVar210 - fVar118;
                  fVar144 = fVar169 - fVar120;
                  fVar235 = (local_11f8 * (fVar223 + local_11c8) - (fVar242 + fVar168) * fVar183) *
                            fVar187 + ((fVar249 + fVar251) * fVar183 -
                                      (fVar223 + local_11c8) * fVar230) * fVar198 +
                                      (fVar230 * (fVar242 + fVar168) -
                                      (fVar249 + fVar251) * local_11f8) * fVar225;
                  fVar239 = (fStack_11f4 * (fVar224 + fStack_11c4) - (fVar243 + fVar208) * fVar186)
                            * fVar187 +
                            ((fVar252 + fVar253) * fVar186 - (fVar224 + fStack_11c4) * fVar185) *
                            fVar198 + (fVar185 * (fVar243 + fVar208) -
                                      (fVar252 + fVar253) * fStack_11f4) * fVar225;
                  fVar240 = (fStack_11f0 * (fVar226 + fStack_11c0) -
                            (fVar244 + fVar210) * fStack_11e0) * fVar187 +
                            ((fVar254 + fStack_1340) * fStack_11e0 -
                            (fVar226 + fStack_11c0) * fStack_11d0) * fVar198 +
                            (fStack_11d0 * (fVar244 + fVar210) -
                            (fVar254 + fStack_1340) * fStack_11f0) * fVar225;
                  fVar241 = (fStack_11ec * (fVar257 + fStack_11bc) -
                            (fVar250 + fVar169) * fStack_11dc) * fVar187 +
                            ((fVar72 + fStack_133c) * fStack_11dc -
                            (fVar257 + fStack_11bc) * fStack_11cc) * fVar198 +
                            (fStack_11cc * (fVar250 + fVar169) -
                            (fVar72 + fStack_133c) * fStack_11ec) * fVar225;
                  fVar228 = local_11c8 - fVar74;
                  fVar229 = fStack_11c4 - fVar113;
                  fStack_1200 = fStack_11c0 - fVar119;
                  fStack_11fc = fStack_11bc - fVar121;
                  local_1208 = CONCAT44(fVar229,fVar228);
                  local_13b8._0_4_ =
                       (fVar219 * (local_11c8 + fVar74) - (fVar168 + fVar73) * fVar228) * fVar187 +
                       ((fVar251 + fVar231) * fVar228 - (local_11c8 + fVar74) * fVar145) * fVar198 +
                       (fVar145 * (fVar168 + fVar73) - (fVar251 + fVar231) * fVar219) * fVar225;
                  local_13b8._4_4_ =
                       (fVar122 * (fStack_11c4 + fVar113) - (fVar208 + fVar112) * fVar229) * fVar187
                       + ((fVar253 + fVar232) * fVar229 - (fStack_11c4 + fVar113) * fVar146) *
                         fVar198 + (fVar146 * (fVar208 + fVar112) - (fVar253 + fVar232) * fVar122) *
                                   fVar225;
                  fStack_13b0 = (fVar143 * (fStack_11c0 + fVar119) -
                                (fVar210 + fVar118) * fStack_1200) * fVar187 +
                                ((fStack_1340 + fVar233) * fStack_1200 -
                                (fStack_11c0 + fVar119) * fVar166) * fVar198 +
                                (fVar166 * (fVar210 + fVar118) - (fStack_1340 + fVar233) * fVar143)
                                * fVar225;
                  fStack_13ac = (fVar144 * (fStack_11bc + fVar121) -
                                (fVar169 + fVar120) * fStack_11fc) * fVar187 +
                                ((fStack_133c + fVar234) * fStack_11fc -
                                (fStack_11bc + fVar121) * fVar167) * fVar198 +
                                (fVar167 * (fVar169 + fVar120) - (fStack_133c + fVar234) * fVar144)
                                * fVar225;
                  fVar184 = fVar231 - fVar249;
                  fVar196 = fVar232 - fVar252;
                  fVar197 = fVar233 - fVar254;
                  fVar199 = fVar234 - fVar72;
                  fVar245 = fVar73 - fVar242;
                  fVar246 = fVar112 - fVar243;
                  fVar247 = fVar118 - fVar244;
                  fVar248 = fVar120 - fVar250;
                  fVar207 = fVar74 - fVar223;
                  fVar209 = fVar113 - fVar224;
                  fVar211 = fVar119 - fVar226;
                  fVar220 = fVar121 - fVar257;
                  auVar154._0_4_ =
                       (fVar245 * (fVar223 + fVar74) - (fVar242 + fVar73) * fVar207) * fVar187 +
                       ((fVar249 + fVar231) * fVar207 - (fVar223 + fVar74) * fVar184) * fVar198 +
                       (fVar184 * (fVar242 + fVar73) - (fVar249 + fVar231) * fVar245) * fVar225;
                  auVar154._4_4_ =
                       (fVar246 * (fVar224 + fVar113) - (fVar243 + fVar112) * fVar209) * fVar187 +
                       ((fVar252 + fVar232) * fVar209 - (fVar224 + fVar113) * fVar196) * fVar198 +
                       (fVar196 * (fVar243 + fVar112) - (fVar252 + fVar232) * fVar246) * fVar225;
                  auVar154._8_4_ =
                       (fVar247 * (fVar226 + fVar119) - (fVar244 + fVar118) * fVar211) * fVar187 +
                       ((fVar254 + fVar233) * fVar211 - (fVar226 + fVar119) * fVar197) * fVar198 +
                       (fVar197 * (fVar244 + fVar118) - (fVar254 + fVar233) * fVar247) * fVar225;
                  auVar154._12_4_ =
                       (fVar248 * (fVar257 + fVar121) - (fVar250 + fVar120) * fVar220) * fVar187 +
                       ((fVar72 + fVar234) * fVar220 - (fVar257 + fVar121) * fVar199) * fVar198 +
                       (fVar199 * (fVar250 + fVar120) - (fVar72 + fVar234) * fVar248) * fVar225;
                  auVar178._0_4_ = fVar235 + (float)local_13b8._0_4_ + auVar154._0_4_;
                  auVar178._4_4_ = fVar239 + (float)local_13b8._4_4_ + auVar154._4_4_;
                  auVar178._8_4_ = fVar240 + fStack_13b0 + auVar154._8_4_;
                  auVar178._12_4_ = fVar241 + fStack_13ac + auVar154._12_4_;
                  auVar236._4_4_ = fVar239;
                  auVar236._0_4_ = fVar235;
                  auVar236._8_4_ = fVar240;
                  auVar236._12_4_ = fVar241;
                  auVar78 = minps(auVar236,_local_13b8);
                  auVar124 = minps(auVar78,auVar154);
                  auVar203._4_4_ = fVar239;
                  auVar203._0_4_ = fVar235;
                  auVar203._8_4_ = fVar240;
                  auVar203._12_4_ = fVar241;
                  auVar78 = maxps(auVar203,_local_13b8);
                  auVar78 = maxps(auVar78,auVar154);
                  local_1218 = ABS(auVar178._0_4_);
                  fStack_1214 = ABS(auVar178._4_4_);
                  fStack_1210 = ABS(auVar178._8_4_);
                  fStack_120c = ABS(auVar178._12_4_);
                  auVar204._4_4_ = -(uint)(auVar78._4_4_ <= fStack_1214 * 1.1920929e-07);
                  auVar204._0_4_ = -(uint)(auVar78._0_4_ <= local_1218 * 1.1920929e-07);
                  auVar204._8_4_ = -(uint)(auVar78._8_4_ <= fStack_1210 * 1.1920929e-07);
                  auVar204._12_4_ = -(uint)(auVar78._12_4_ <= fStack_120c * 1.1920929e-07);
                  auVar237._4_4_ = -(uint)(-(fStack_1214 * 1.1920929e-07) <= auVar124._4_4_);
                  auVar237._0_4_ = -(uint)(-(local_1218 * 1.1920929e-07) <= auVar124._0_4_);
                  auVar237._8_4_ = -(uint)(-(fStack_1210 * 1.1920929e-07) <= auVar124._8_4_);
                  auVar237._12_4_ = -(uint)(-(fStack_120c * 1.1920929e-07) <= auVar124._12_4_);
                  auVar204 = auVar204 | auVar237;
                  iVar38 = movmskps(uVar37,auVar204);
                  uVar54 = local_1138;
                  if (iVar38 != 0) {
                    uVar45 = (uint)DAT_01fec6c0;
                    uVar59 = DAT_01fec6c0._4_4_;
                    uVar62 = DAT_01fec6c0._8_4_;
                    uVar65 = DAT_01fec6c0._12_4_;
                    uVar36 = -(uint)((float)((uint)(fVar245 * fVar228) & uVar45) <=
                                    (float)((uint)(fVar219 * fVar183) & uVar45));
                    uVar46 = -(uint)((float)((uint)(fVar246 * fVar229) & uVar59) <=
                                    (float)((uint)(fVar122 * fVar186) & uVar59));
                    uVar60 = -(uint)((float)((uint)(fVar247 * fStack_1200) & uVar62) <=
                                    (float)((uint)(fVar143 * fStack_11e0) & uVar62));
                    uVar63 = -(uint)((float)((uint)(fVar248 * fStack_11fc) & uVar65) <=
                                    (float)((uint)(fVar144 * fStack_11dc) & uVar65));
                    auVar155._0_4_ = (float)((uint)(fVar145 * fVar207) & uVar45);
                    auVar155._4_4_ = (float)((uint)(fVar146 * fVar209) & uVar59);
                    auVar155._8_4_ = (float)((uint)(fVar166 * fVar211) & uVar62);
                    auVar155._12_4_ = (float)((uint)(fVar167 * fVar220) & uVar65);
                    uVar37 = -(uint)(auVar155._0_4_ <= (float)((uint)(fVar230 * fVar228) & uVar45));
                    uVar58 = -(uint)(auVar155._4_4_ <= (float)((uint)(fVar185 * fVar229) & uVar59));
                    uVar61 = -(uint)(auVar155._8_4_ <=
                                    (float)((uint)(fStack_11d0 * fStack_1200) & uVar62));
                    uVar64 = -(uint)(auVar155._12_4_ <=
                                    (float)((uint)(fStack_11cc * fStack_11fc) & uVar65));
                    uVar45 = -(uint)((float)((uint)(fVar184 * fVar219) & uVar45) <=
                                    (float)((uint)(fVar145 * local_11f8) & uVar45));
                    uVar59 = -(uint)((float)((uint)(fVar196 * fVar122) & uVar59) <=
                                    (float)((uint)(fVar146 * fStack_11f4) & uVar59));
                    uVar62 = -(uint)((float)((uint)(fVar197 * fVar143) & uVar62) <=
                                    (float)((uint)(fVar166 * fStack_11f0) & uVar62));
                    uVar65 = -(uint)((float)((uint)(fVar199 * fVar144) & uVar65) <=
                                    (float)((uint)(fVar167 * fStack_11ec) & uVar65));
                    auVar96._0_4_ = (uint)(fVar219 * fVar207 - fVar245 * fVar228) & uVar36;
                    auVar96._4_4_ = (uint)(fVar122 * fVar209 - fVar246 * fVar229) & uVar46;
                    auVar96._8_4_ = (uint)(fVar143 * fVar211 - fVar247 * fStack_1200) & uVar60;
                    auVar96._12_4_ = (uint)(fVar144 * fVar220 - fVar248 * fStack_11fc) & uVar63;
                    auVar238._0_4_ = ~uVar36 & (uint)(local_11f8 * fVar228 - fVar219 * fVar183);
                    auVar238._4_4_ = ~uVar46 & (uint)(fStack_11f4 * fVar229 - fVar122 * fVar186);
                    auVar238._8_4_ =
                         ~uVar60 & (uint)(fStack_11f0 * fStack_1200 - fVar143 * fStack_11e0);
                    auVar238._12_4_ =
                         ~uVar63 & (uint)(fStack_11ec * fStack_11fc - fVar144 * fStack_11dc);
                    _local_12a8 = auVar238 | auVar96;
                    auVar216._0_4_ = (uint)(fVar184 * fVar228 - fVar145 * fVar207) & uVar37;
                    auVar216._4_4_ = (uint)(fVar196 * fVar229 - fVar146 * fVar209) & uVar58;
                    auVar216._8_4_ = (uint)(fVar197 * fStack_1200 - fVar166 * fVar211) & uVar61;
                    auVar216._12_4_ = (uint)(fVar199 * fStack_11fc - fVar167 * fVar220) & uVar64;
                    auVar258._0_4_ = ~uVar37 & (uint)(fVar183 * fVar145 - fVar230 * fVar228);
                    auVar258._4_4_ = ~uVar58 & (uint)(fVar186 * fVar146 - fVar185 * fVar229);
                    auVar258._8_4_ =
                         ~uVar61 & (uint)(fStack_11e0 * fVar166 - fStack_11d0 * fStack_1200);
                    auVar258._12_4_ =
                         ~uVar64 & (uint)(fStack_11dc * fVar167 - fStack_11cc * fStack_11fc);
                    _local_1298 = auVar258 | auVar216;
                    local_1288[0] =
                         (float)(~uVar45 & (uint)(fVar230 * fVar219 - fVar145 * local_11f8) |
                                (uint)(fVar145 * fVar245 - fVar184 * fVar219) & uVar45);
                    local_1288[1] =
                         (float)(~uVar59 & (uint)(fVar185 * fVar122 - fVar146 * fStack_11f4) |
                                (uint)(fVar146 * fVar246 - fVar196 * fVar122) & uVar59);
                    local_1288[2] =
                         (float)(~uVar62 & (uint)(fStack_11d0 * fVar143 - fVar166 * fStack_11f0) |
                                (uint)(fVar166 * fVar247 - fVar197 * fVar143) & uVar62);
                    local_1288[3] =
                         (float)(~uVar65 & (uint)(fStack_11cc * fVar144 - fVar167 * fStack_11ec) |
                                (uint)(fVar167 * fVar248 - fVar199 * fVar144) & uVar65);
                    fVar113 = fVar187 * local_12a8._0_4_ +
                              fVar198 * local_1298._0_4_ + fVar225 * local_1288[0];
                    fVar230 = fVar187 * local_12a8._4_4_ +
                              fVar198 * local_1298._4_4_ + fVar225 * local_1288[1];
                    fVar219 = fVar187 * local_12a8._8_4_ +
                              fVar198 * local_1298._8_4_ + fVar225 * local_1288[2];
                    fVar198 = fVar187 * local_12a8._12_4_ +
                              fVar198 * local_1298._12_4_ + fVar225 * local_1288[3];
                    fVar113 = fVar113 + fVar113;
                    fVar230 = fVar230 + fVar230;
                    fVar219 = fVar219 + fVar219;
                    fVar198 = fVar198 + fVar198;
                    fVar73 = fVar251 * local_12a8._0_4_ +
                             fVar168 * local_1298._0_4_ + local_11c8 * local_1288[0];
                    fVar74 = fVar253 * local_12a8._4_4_ +
                             fVar208 * local_1298._4_4_ + fStack_11c4 * local_1288[1];
                    fVar251 = fStack_1340 * local_12a8._8_4_ +
                              fVar210 * local_1298._8_4_ + fStack_11c0 * local_1288[2];
                    fVar112 = fStack_133c * local_12a8._12_4_ +
                              fVar169 * local_1298._12_4_ + fStack_11bc * local_1288[3];
                    auVar17._4_4_ = fVar230;
                    auVar17._0_4_ = fVar113;
                    auVar17._8_4_ = fVar219;
                    auVar17._12_4_ = fVar198;
                    auVar78 = rcpps(auVar155,auVar17);
                    fVar72 = auVar78._0_4_;
                    fVar250 = auVar78._4_4_;
                    fVar257 = auVar78._8_4_;
                    fVar187 = auVar78._12_4_;
                    local_12b8._0_4_ =
                         ((1.0 - fVar113 * fVar72) * fVar72 + fVar72) * (fVar73 + fVar73);
                    local_12b8._4_4_ =
                         ((1.0 - fVar230 * fVar250) * fVar250 + fVar250) * (fVar74 + fVar74);
                    fStack_12b0 = ((1.0 - fVar219 * fVar257) * fVar257 + fVar257) *
                                  (fVar251 + fVar251);
                    fStack_12ac = ((1.0 - fVar198 * fVar187) * fVar187 + fVar187) *
                                  (fVar112 + fVar112);
                    fVar72 = *(float *)(ray + k * 4 + 0x80);
                    fVar250 = *(float *)(ray + k * 4 + 0x30);
                    auVar156._0_4_ =
                         -(uint)((float)local_12b8._0_4_ <= fVar72 &&
                                fVar250 <= (float)local_12b8._0_4_) & auVar204._0_4_;
                    auVar156._4_4_ =
                         -(uint)((float)local_12b8._4_4_ <= fVar72 &&
                                fVar250 <= (float)local_12b8._4_4_) & auVar204._4_4_;
                    auVar156._8_4_ =
                         -(uint)(fStack_12b0 <= fVar72 && fVar250 <= fStack_12b0) & auVar204._8_4_;
                    auVar156._12_4_ =
                         -(uint)(fStack_12ac <= fVar72 && fVar250 <= fStack_12ac) & auVar204._12_4_;
                    iVar38 = movmskps(iVar38,auVar156);
                    if (iVar38 != 0) {
                      valid.field_0.i[0] = auVar156._0_4_ & -(uint)(fVar113 != 0.0);
                      valid.field_0.i[1] = auVar156._4_4_ & -(uint)(fVar230 != 0.0);
                      valid.field_0.i[2] = auVar156._8_4_ & -(uint)(fVar219 != 0.0);
                      valid.field_0.i[3] = auVar156._12_4_ & -(uint)(fVar198 != 0.0);
                      iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
                      if (iVar38 != 0) {
                        auVar133._4_12_ = local_12b8._4_12_;
                        auVar133._0_4_ = (float)(int)(*(ushort *)(lVar13 + 8 + lVar56) - 1);
                        auVar221._4_4_ = local_12b8._4_4_;
                        auVar221._0_4_ = auVar133._0_4_;
                        auVar221._8_4_ = fStack_12b0;
                        auVar221._12_4_ = fStack_12ac;
                        auVar78 = rcpss(auVar221,auVar133);
                        fVar72 = (2.0 - auVar133._0_4_ * auVar78._0_4_) * auVar78._0_4_;
                        auVar222._4_12_ = auVar78._4_12_;
                        auVar222._0_4_ = (float)(int)(*(ushort *)(lVar13 + 10 + lVar56) - 1);
                        auVar227._4_4_ = auVar78._4_4_;
                        auVar227._0_4_ = auVar222._0_4_;
                        auVar227._8_4_ = auVar78._8_4_;
                        auVar227._12_4_ = auVar78._12_4_;
                        auVar78 = rcpss(auVar227,auVar222);
                        fVar250 = (2.0 - auVar222._0_4_ * auVar78._0_4_) * auVar78._0_4_;
                        tNear.field_0.v[0] =
                             fVar72 * ((float)(int)local_1258._0_4_ * auVar178._0_4_ +
                                      (auVar178._0_4_ - fVar235));
                        tNear.field_0.v[1] =
                             fVar72 * ((float)(local_1258._0_4_ + 1) * auVar178._4_4_ +
                                      (auVar178._4_4_ - fVar239));
                        tNear.field_0.v[2] =
                             fVar72 * ((float)(local_1258._0_4_ + 1) * auVar178._8_4_ +
                                      (auVar178._8_4_ - fVar240));
                        tNear.field_0.v[3] =
                             fVar72 * ((float)(int)local_1258._0_4_ * auVar178._12_4_ +
                                      (auVar178._12_4_ - fVar241));
                        auVar194._0_4_ =
                             (float)(int)local_1268._0_4_ * auVar178._0_4_ +
                             (auVar178._0_4_ - (float)local_13b8._0_4_);
                        auVar194._4_4_ =
                             (float)(int)local_1268._0_4_ * auVar178._4_4_ +
                             (auVar178._4_4_ - (float)local_13b8._4_4_);
                        auVar194._8_4_ =
                             (float)(local_1268._0_4_ + 1) * auVar178._8_4_ +
                             (auVar178._8_4_ - fStack_13b0);
                        auVar194._12_4_ =
                             (float)(local_1268._0_4_ + 1) * auVar178._12_4_ +
                             (auVar178._12_4_ - fStack_13ac);
                        pGVar12 = (context->scene->geometries).items[uVar52].ptr;
                        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar78 = rcpps(auVar194,auVar178);
                          fVar72 = auVar78._0_4_;
                          fVar257 = auVar78._4_4_;
                          fVar187 = auVar78._8_4_;
                          fVar73 = auVar78._12_4_;
                          fVar72 = (float)(-(uint)(1e-18 <= local_1218) &
                                          (uint)(((float)DAT_01feca10 - auVar178._0_4_ * fVar72) *
                                                 fVar72 + fVar72));
                          fVar257 = (float)(-(uint)(1e-18 <= fStack_1214) &
                                           (uint)((DAT_01feca10._4_4_ - auVar178._4_4_ * fVar257) *
                                                  fVar257 + fVar257));
                          fVar187 = (float)(-(uint)(1e-18 <= fStack_1210) &
                                           (uint)((DAT_01feca10._8_4_ - auVar178._8_4_ * fVar187) *
                                                  fVar187 + fVar187));
                          fVar73 = (float)(-(uint)(1e-18 <= fStack_120c) &
                                          (uint)((DAT_01feca10._12_4_ - auVar178._12_4_ * fVar73) *
                                                 fVar73 + fVar73));
                          auVar97._0_4_ = tNear.field_0.v[0] * fVar72;
                          auVar97._4_4_ = tNear.field_0.v[1] * fVar257;
                          auVar97._8_4_ = tNear.field_0.v[2] * fVar187;
                          auVar97._12_4_ = tNear.field_0.v[3] * fVar73;
                          local_12d8 = minps(auVar97,_DAT_01feca10);
                          auVar134._0_4_ = fVar250 * auVar194._0_4_ * fVar72;
                          auVar134._4_4_ = fVar250 * auVar194._4_4_ * fVar257;
                          auVar134._8_4_ = fVar250 * auVar194._8_4_ * fVar187;
                          auVar134._12_4_ = fVar250 * auVar194._12_4_ * fVar73;
                          local_12c8 = minps(auVar134,_DAT_01feca10);
                          auVar124 = ~(undefined1  [16])valid.field_0 & _DAT_01feb9f0 |
                                     _local_12b8 & (undefined1  [16])valid.field_0;
                          auVar179._4_4_ = auVar124._0_4_;
                          auVar179._0_4_ = auVar124._4_4_;
                          auVar179._8_4_ = auVar124._12_4_;
                          auVar179._12_4_ = auVar124._8_4_;
                          auVar78 = minps(auVar179,auVar124);
                          auVar98._0_8_ = auVar78._8_8_;
                          auVar98._8_4_ = auVar78._0_4_;
                          auVar98._12_4_ = auVar78._4_4_;
                          auVar78 = minps(auVar98,auVar78);
                          auVar99._0_8_ =
                               CONCAT44(-(uint)(auVar78._4_4_ == auVar124._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar78._0_4_ == auVar124._0_4_) &
                                        valid.field_0.i[0]);
                          auVar99._8_4_ =
                               -(uint)(auVar78._8_4_ == auVar124._8_4_) & valid.field_0.i[2];
                          auVar99._12_4_ =
                               -(uint)(auVar78._12_4_ == auVar124._12_4_) & valid.field_0.i[3];
                          iVar38 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar99);
                          aVar157 = valid.field_0;
                          if (iVar38 != 0) {
                            aVar157.i[2] = auVar99._8_4_;
                            aVar157._0_8_ = auVar99._0_8_;
                            aVar157.i[3] = auVar99._12_4_;
                          }
                          uVar36 = movmskps(iVar38,(undefined1  [16])aVar157);
                          lVar41 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                            }
                          }
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar35 = *(undefined4 *)(local_12d8 + lVar41 * 4);
                            uVar6 = *(undefined4 *)(local_12c8 + lVar41 * 4);
                            uVar48 = *(undefined4 *)(local_12a8 + lVar41 * 4);
                            fVar72 = local_1288[lVar41 + -4];
                            fVar250 = local_1288[lVar41];
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_12b8 + lVar41 * 4);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar48;
                            *(float *)(ray + k * 4 + 0xd0) = fVar72;
                            *(float *)(ray + k * 4 + 0xe0) = fVar250;
                            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar35;
                            *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
                            *(uint *)(ray + k * 4 + 0x110) = uVar39;
                            *(int *)(ray + k * 4 + 0x120) = (int)uVar52;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            uVar6 = local_1088._0_4_;
                            uVar35 = local_1098._0_4_;
                            local_1348 = CONCAT44(local_1098._0_4_,local_1098._0_4_);
                            fStack_1340 = (float)local_1098._0_4_;
                            fStack_133c = (float)local_1098._0_4_;
                            uVar7 = *(undefined8 *)(mm_lookupmask_ps + lVar40);
                            uVar25 = *(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
                            do {
                              uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
                              local_1048 = *(undefined4 *)(local_12d8 + lVar41 * 4);
                              local_1038 = *(undefined4 *)(local_12c8 + lVar41 * 4);
                              *(undefined4 *)(ray + k * 4 + 0x80) =
                                   *(undefined4 *)(local_12b8 + lVar41 * 4);
                              args.context = context->user;
                              local_1078 = *(undefined4 *)(local_12a8 + lVar41 * 4);
                              fVar72 = local_1288[lVar41 + -4];
                              fVar250 = local_1288[lVar41];
                              local_1068._4_4_ = fVar72;
                              local_1068._0_4_ = fVar72;
                              fStack_1060 = fVar72;
                              fStack_105c = fVar72;
                              local_1058._4_4_ = fVar250;
                              local_1058._0_4_ = fVar250;
                              fStack_1050 = fVar250;
                              fStack_104c = fVar250;
                              uStack_1074 = local_1078;
                              uStack_1070 = local_1078;
                              uStack_106c = local_1078;
                              uStack_1044 = local_1048;
                              uStack_1040 = local_1048;
                              uStack_103c = local_1048;
                              uStack_1034 = local_1038;
                              uStack_1030 = local_1038;
                              uStack_102c = local_1038;
                              local_1028 = local_1348;
                              uStack_1020 = CONCAT44(uVar35,uVar35);
                              local_1018 = CONCAT44(uVar6,uVar6);
                              uStack_1010 = CONCAT44(uVar6,uVar6);
                              local_1008 = (args.context)->instID[0];
                              uStack_1004 = local_1008;
                              uStack_1000 = local_1008;
                              uStack_ffc = local_1008;
                              local_ff8 = (args.context)->instPrimID[0];
                              uStack_ff4 = local_ff8;
                              uStack_ff0 = local_ff8;
                              uStack_fec = local_ff8;
                              args.valid = (int *)&local_13d8;
                              pRVar49 = (RTCIntersectArguments *)pGVar12->userPtr;
                              args.hit = (RTCHitN *)&local_1078;
                              args.N = 4;
                              p_Var44 = pGVar12->intersectionFilterN;
                              local_13d8 = uVar7;
                              uStack_13d0 = uVar25;
                              args.geometryUserPtr = pRVar49;
                              args.ray = (RTCRayN *)ray;
                              if (p_Var44 != (RTCFilterFunctionN)0x0) {
                                p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                              }
                              auVar103._0_4_ = -(uint)((int)local_13d8 == 0);
                              auVar103._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                              auVar103._8_4_ = -(uint)((int)uStack_13d0 == 0);
                              auVar103._12_4_ = -(uint)(uStack_13d0._4_4_ == 0);
                              uVar36 = movmskps((int)p_Var44,auVar103);
                              pRVar43 = (RTCRayN *)(ulong)(uVar36 ^ 0xf);
                              if ((uVar36 ^ 0xf) == 0) {
                                auVar103 = auVar103 ^ _DAT_01febe20;
                              }
                              else {
                                pRVar49 = context->args;
                                p_Var44 = pRVar49->filter;
                                if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar49->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                                  p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                                }
                                auVar139._0_4_ = -(uint)((int)local_13d8 == 0);
                                auVar139._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                                auVar139._8_4_ = -(uint)((int)uStack_13d0 == 0);
                                auVar139._12_4_ = -(uint)(uStack_13d0._4_4_ == 0);
                                auVar103 = auVar139 ^ _DAT_01febe20;
                                uVar36 = movmskps((int)p_Var44,auVar139);
                                pRVar43 = (RTCRayN *)(ulong)(uVar36 ^ 0xf);
                                if ((uVar36 ^ 0xf) != 0) {
                                  auVar161._0_4_ = *(uint *)(args.ray + 0xc0) & auVar139._0_4_;
                                  auVar161._4_4_ = *(uint *)(args.ray + 0xc4) & auVar139._4_4_;
                                  auVar161._8_4_ = *(uint *)(args.ray + 200) & auVar139._8_4_;
                                  auVar161._12_4_ = *(uint *)(args.ray + 0xcc) & auVar139._12_4_;
                                  auVar218._0_4_ = ~auVar139._0_4_ & *(uint *)args.hit;
                                  auVar218._4_4_ = ~auVar139._4_4_ & *(uint *)(args.hit + 4);
                                  auVar218._8_4_ = ~auVar139._8_4_ & *(uint *)(args.hit + 8);
                                  auVar218._12_4_ = ~auVar139._12_4_ & *(uint *)(args.hit + 0xc);
                                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar218 | auVar161;
                                  uVar36 = *(uint *)(args.hit + 0x14);
                                  uVar39 = *(uint *)(args.hit + 0x18);
                                  uVar37 = *(uint *)(args.hit + 0x1c);
                                  *(uint *)(args.ray + 0xd0) =
                                       ~auVar139._0_4_ & *(uint *)(args.hit + 0x10) |
                                       *(uint *)(args.ray + 0xd0) & auVar139._0_4_;
                                  *(uint *)(args.ray + 0xd4) =
                                       ~auVar139._4_4_ & uVar36 |
                                       *(uint *)(args.ray + 0xd4) & auVar139._4_4_;
                                  *(uint *)(args.ray + 0xd8) =
                                       ~auVar139._8_4_ & uVar39 |
                                       *(uint *)(args.ray + 0xd8) & auVar139._8_4_;
                                  *(uint *)(args.ray + 0xdc) =
                                       ~auVar139._12_4_ & uVar37 |
                                       *(uint *)(args.ray + 0xdc) & auVar139._12_4_;
                                  auVar195._0_4_ = *(uint *)(args.ray + 0xe0) & auVar139._0_4_;
                                  auVar195._4_4_ = *(uint *)(args.ray + 0xe4) & auVar139._4_4_;
                                  auVar195._8_4_ = *(uint *)(args.ray + 0xe8) & auVar139._8_4_;
                                  auVar195._12_4_ = *(uint *)(args.ray + 0xec) & auVar139._12_4_;
                                  auVar162._0_4_ = ~auVar139._0_4_ & *(uint *)(args.hit + 0x20);
                                  auVar162._4_4_ = ~auVar139._4_4_ & *(uint *)(args.hit + 0x24);
                                  auVar162._8_4_ = ~auVar139._8_4_ & *(uint *)(args.hit + 0x28);
                                  auVar162._12_4_ = ~auVar139._12_4_ & *(uint *)(args.hit + 0x2c);
                                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar162 | auVar195;
                                  auVar206._0_4_ = *(uint *)(args.ray + 0xf0) & auVar139._0_4_;
                                  auVar206._4_4_ = *(uint *)(args.ray + 0xf4) & auVar139._4_4_;
                                  auVar206._8_4_ = *(uint *)(args.ray + 0xf8) & auVar139._8_4_;
                                  auVar206._12_4_ = *(uint *)(args.ray + 0xfc) & auVar139._12_4_;
                                  auVar163._0_4_ = ~auVar139._0_4_ & *(uint *)(args.hit + 0x30);
                                  auVar163._4_4_ = ~auVar139._4_4_ & *(uint *)(args.hit + 0x34);
                                  auVar163._8_4_ = ~auVar139._8_4_ & *(uint *)(args.hit + 0x38);
                                  auVar163._12_4_ = ~auVar139._12_4_ & *(uint *)(args.hit + 0x3c);
                                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar163 | auVar206;
                                  uVar36 = *(uint *)(args.hit + 0x44);
                                  uVar39 = *(uint *)(args.hit + 0x48);
                                  uVar37 = *(uint *)(args.hit + 0x4c);
                                  *(uint *)(args.ray + 0x100) =
                                       ~auVar139._0_4_ & *(uint *)(args.hit + 0x40) |
                                       *(uint *)(args.ray + 0x100) & auVar139._0_4_;
                                  *(uint *)(args.ray + 0x104) =
                                       ~auVar139._4_4_ & uVar36 |
                                       *(uint *)(args.ray + 0x104) & auVar139._4_4_;
                                  *(uint *)(args.ray + 0x108) =
                                       ~auVar139._8_4_ & uVar39 |
                                       *(uint *)(args.ray + 0x108) & auVar139._8_4_;
                                  *(uint *)(args.ray + 0x10c) =
                                       ~auVar139._12_4_ & uVar37 |
                                       *(uint *)(args.ray + 0x10c) & auVar139._12_4_;
                                  uVar36 = *(uint *)(args.hit + 0x54);
                                  uVar39 = *(uint *)(args.hit + 0x58);
                                  uVar37 = *(uint *)(args.hit + 0x5c);
                                  *(uint *)(args.ray + 0x110) =
                                       *(uint *)(args.ray + 0x110) & auVar139._0_4_ |
                                       ~auVar139._0_4_ & *(uint *)(args.hit + 0x50);
                                  *(uint *)(args.ray + 0x114) =
                                       *(uint *)(args.ray + 0x114) & auVar139._4_4_ |
                                       ~auVar139._4_4_ & uVar36;
                                  *(uint *)(args.ray + 0x118) =
                                       *(uint *)(args.ray + 0x118) & auVar139._8_4_ |
                                       ~auVar139._8_4_ & uVar39;
                                  *(uint *)(args.ray + 0x11c) =
                                       *(uint *)(args.ray + 0x11c) & auVar139._12_4_ |
                                       ~auVar139._12_4_ & uVar37;
                                  uVar36 = *(uint *)(args.hit + 100);
                                  uVar39 = *(uint *)(args.hit + 0x68);
                                  uVar37 = *(uint *)(args.hit + 0x6c);
                                  *(uint *)(args.ray + 0x120) =
                                       *(uint *)(args.ray + 0x120) & auVar139._0_4_ |
                                       ~auVar139._0_4_ & *(uint *)(args.hit + 0x60);
                                  *(uint *)(args.ray + 0x124) =
                                       *(uint *)(args.ray + 0x124) & auVar139._4_4_ |
                                       ~auVar139._4_4_ & uVar36;
                                  *(uint *)(args.ray + 0x128) =
                                       *(uint *)(args.ray + 0x128) & auVar139._8_4_ |
                                       ~auVar139._8_4_ & uVar39;
                                  *(uint *)(args.ray + 300) =
                                       *(uint *)(args.ray + 300) & auVar139._12_4_ |
                                       ~auVar139._12_4_ & uVar37;
                                  auVar164._0_4_ = *(uint *)(args.ray + 0x130) & auVar139._0_4_;
                                  auVar164._4_4_ = *(uint *)(args.ray + 0x134) & auVar139._4_4_;
                                  auVar164._8_4_ = *(uint *)(args.ray + 0x138) & auVar139._8_4_;
                                  auVar164._12_4_ = *(uint *)(args.ray + 0x13c) & auVar139._12_4_;
                                  auVar181._0_4_ = ~auVar139._0_4_ & *(uint *)(args.hit + 0x70);
                                  auVar181._4_4_ = ~auVar139._4_4_ & *(uint *)(args.hit + 0x74);
                                  auVar181._8_4_ = ~auVar139._8_4_ & *(uint *)(args.hit + 0x78);
                                  auVar181._12_4_ = ~auVar139._12_4_ & *(uint *)(args.hit + 0x7c);
                                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar181 | auVar164;
                                  uVar36 = *(uint *)(args.hit + 0x84);
                                  uVar39 = *(uint *)(args.hit + 0x88);
                                  uVar37 = *(uint *)(args.hit + 0x8c);
                                  *(uint *)(args.ray + 0x140) =
                                       ~auVar139._0_4_ & *(uint *)(args.hit + 0x80) |
                                       *(uint *)(args.ray + 0x140) & auVar139._0_4_;
                                  *(uint *)(args.ray + 0x144) =
                                       ~auVar139._4_4_ & uVar36 |
                                       *(uint *)(args.ray + 0x144) & auVar139._4_4_;
                                  *(uint *)(args.ray + 0x148) =
                                       ~auVar139._8_4_ & uVar39 |
                                       *(uint *)(args.ray + 0x148) & auVar139._8_4_;
                                  *(uint *)(args.ray + 0x14c) =
                                       ~auVar139._12_4_ & uVar37 |
                                       *(uint *)(args.ray + 0x14c) & auVar139._12_4_;
                                  pRVar43 = args.ray;
                                  pRVar49 = (RTCIntersectArguments *)args.hit;
                                }
                              }
                              auVar104._0_4_ = auVar103._0_4_ << 0x1f;
                              auVar104._4_4_ = auVar103._4_4_ << 0x1f;
                              auVar104._8_4_ = auVar103._8_4_ << 0x1f;
                              auVar104._12_4_ = auVar103._12_4_ << 0x1f;
                              iVar38 = movmskps((int)pRVar43,auVar104);
                              if (iVar38 == 0) {
                                *(undefined4 *)(ray + k * 4 + 0x80) = uVar48;
                              }
                              valid.field_0.v[lVar41] = 0.0;
                              fVar72 = *(float *)(ray + k * 4 + 0x80);
                              valid.field_0.i[0] =
                                   -(uint)(local_12b8._0_4_ <= fVar72) & valid.field_0.i[0];
                              valid.field_0.i[1] =
                                   -(uint)(local_12b8._4_4_ <= fVar72) & valid.field_0.i[1];
                              valid.field_0.i[2] =
                                   -(uint)(local_12b8._8_4_ <= fVar72) & valid.field_0.i[2];
                              valid.field_0.i[3] =
                                   -(uint)(local_12b8._12_4_ <= fVar72) & valid.field_0.i[3];
                              iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
                              if (iVar38 != 0) {
                                auVar140._0_4_ = (uint)local_12b8._0_4_ & valid.field_0.i[0];
                                auVar140._4_4_ = (uint)local_12b8._4_4_ & valid.field_0.i[1];
                                auVar140._8_4_ = (uint)local_12b8._8_4_ & valid.field_0.i[2];
                                auVar140._12_4_ = (uint)local_12b8._12_4_ & valid.field_0.i[3];
                                auVar165._0_8_ =
                                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                     0x7f8000007f800000;
                                auVar165._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                                auVar165._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                                auVar165 = auVar165 | auVar140;
                                auVar182._4_4_ = auVar165._0_4_;
                                auVar182._0_4_ = auVar165._4_4_;
                                auVar182._8_4_ = auVar165._12_4_;
                                auVar182._12_4_ = auVar165._8_4_;
                                auVar78 = minps(auVar182,auVar165);
                                auVar141._0_8_ = auVar78._8_8_;
                                auVar141._8_4_ = auVar78._0_4_;
                                auVar141._12_4_ = auVar78._4_4_;
                                auVar78 = minps(auVar141,auVar78);
                                auVar142._0_8_ =
                                     CONCAT44(-(uint)(auVar78._4_4_ == auVar165._4_4_) &
                                              valid.field_0.i[1],
                                              -(uint)(auVar78._0_4_ == auVar165._0_4_) &
                                              valid.field_0.i[0]);
                                auVar142._8_4_ =
                                     -(uint)(auVar78._8_4_ == auVar165._8_4_) & valid.field_0.i[2];
                                auVar142._12_4_ =
                                     -(uint)(auVar78._12_4_ == auVar165._12_4_) & valid.field_0.i[3]
                                ;
                                iVar47 = movmskps((int)pRVar49,auVar142);
                                aVar105 = valid.field_0;
                                if (iVar47 != 0) {
                                  aVar105.i[2] = auVar142._8_4_;
                                  aVar105._0_8_ = auVar142._0_8_;
                                  aVar105.i[3] = auVar142._12_4_;
                                }
                                uVar48 = movmskps(iVar47,(undefined1  [16])aVar105);
                                uVar54 = CONCAT44((int)((ulong)pRVar49 >> 0x20),uVar48);
                                lVar41 = 0;
                                if (uVar54 != 0) {
                                  for (; (uVar54 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                                  }
                                }
                              }
                              uVar54 = local_1138;
                            } while ((char)iVar38 != '\0');
                          }
                        }
                      }
                    }
                  }
                }
                local_1120 = local_1120 & local_1120 - 1;
              } while (local_1120 != 0);
            }
            local_1148 = local_1148 + 1;
          } while (local_1148 != local_1180);
        }
        local_1238 = *(int *)(ray + k * 4 + 0x80);
        iStack_1234 = local_1238;
        iStack_1230 = local_1238;
        iStack_122c = local_1238;
        fVar113 = fStack_10fc;
        fVar198 = fStack_1100;
        fVar225 = fStack_1104;
        fVar230 = local_1108;
        fVar219 = fStack_110c;
        fVar185 = fStack_1110;
        fVar253 = fStack_1114;
        fVar208 = local_1118;
        fVar112 = fStack_123c;
        fVar251 = fStack_1240;
        fVar74 = fStack_1244;
        fVar73 = local_1248;
        fVar187 = fStack_126c;
        fVar257 = fStack_1270;
        fVar250 = fStack_1274;
        fVar72 = local_1278;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }